

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  bool bVar37;
  uint uVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  undefined1 auVar67 [16];
  undefined1 auVar104 [64];
  undefined1 auVar106 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  int iVar110;
  float fVar111;
  undefined4 uVar112;
  vfloat4 a0;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar117 [64];
  float t1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  vfloat4 a0_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar132;
  float fVar140;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vfloat4 b0;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  __m128 a_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vfloat4 b0_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar180;
  float fVar181;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar182;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  __m128 a;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar196 [16];
  undefined1 auVar205 [32];
  vfloat4 a0_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar222;
  float fVar223;
  vfloat4 a0_3;
  undefined1 auVar213 [16];
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar236;
  vfloat4 b0_2;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  vfloat4 b0_3;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 in_ZMM19 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  uint auStack_630 [4];
  RTCFilterFunctionNArguments local_620;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined8 uStack_460;
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar31;
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar249 [32];
  
  PVar6 = prim[1];
  uVar30 = (ulong)(byte)PVar6;
  lVar32 = uVar30 * 0x25;
  fVar132 = *(float *)(prim + lVar32 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar60 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar61 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + lVar32 + 6));
  fVar131 = fVar132 * auVar61._0_4_;
  fVar111 = fVar132 * auVar60._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar30 * 4 + 6);
  auVar76 = vpmovsxbd_avx2(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar30 * 5 + 6);
  auVar75 = vpmovsxbd_avx2(auVar44);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar30 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar52);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar30 * 0xf + 6);
  auVar88 = vpmovsxbd_avx2(auVar51);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar81 = vpmovsxbd_avx2(auVar58);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar81);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar30 + 6);
  auVar77 = vpmovsxbd_avx2(auVar55);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar30 * 0x1a + 6);
  auVar78 = vpmovsxbd_avx2(auVar56);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar30 * 0x1b + 6);
  auVar79 = vpmovsxbd_avx2(auVar57);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar30 * 0x1c + 6);
  auVar74 = vpmovsxbd_avx2(auVar59);
  auVar80 = vcvtdq2ps_avx(auVar74);
  auVar91._4_4_ = fVar111;
  auVar91._0_4_ = fVar111;
  auVar91._8_4_ = fVar111;
  auVar91._12_4_ = fVar111;
  auVar91._16_4_ = fVar111;
  auVar91._20_4_ = fVar111;
  auVar91._24_4_ = fVar111;
  auVar91._28_4_ = fVar111;
  auVar258._8_4_ = 1;
  auVar258._0_8_ = 0x100000001;
  auVar258._12_4_ = 1;
  auVar258._16_4_ = 1;
  auVar258._20_4_ = 1;
  auVar258._24_4_ = 1;
  auVar258._28_4_ = 1;
  auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = ZEXT1632(CONCAT412(fVar132 * auVar60._12_4_,
                               CONCAT48(fVar132 * auVar60._8_4_,
                                        CONCAT44(fVar132 * auVar60._4_4_,fVar111))));
  auVar82 = vpermps_avx2(auVar258,auVar83);
  auVar73 = vpermps_avx512vl(auVar72,auVar83);
  fVar212 = auVar73._0_4_;
  fVar222 = auVar73._4_4_;
  auVar83._4_4_ = fVar222 * auVar87._4_4_;
  auVar83._0_4_ = fVar212 * auVar87._0_4_;
  fVar223 = auVar73._8_4_;
  auVar83._8_4_ = fVar223 * auVar87._8_4_;
  fVar118 = auVar73._12_4_;
  auVar83._12_4_ = fVar118 * auVar87._12_4_;
  fVar119 = auVar73._16_4_;
  auVar83._16_4_ = fVar119 * auVar87._16_4_;
  fVar120 = auVar73._20_4_;
  auVar83._20_4_ = fVar120 * auVar87._20_4_;
  fVar121 = auVar73._24_4_;
  auVar83._24_4_ = fVar121 * auVar87._24_4_;
  auVar83._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar77._4_4_ * fVar222;
  auVar81._0_4_ = auVar77._0_4_ * fVar212;
  auVar81._8_4_ = auVar77._8_4_ * fVar223;
  auVar81._12_4_ = auVar77._12_4_ * fVar118;
  auVar81._16_4_ = auVar77._16_4_ * fVar119;
  auVar81._20_4_ = auVar77._20_4_ * fVar120;
  auVar81._24_4_ = auVar77._24_4_ * fVar121;
  auVar81._28_4_ = auVar74._28_4_;
  auVar74._4_4_ = auVar80._4_4_ * fVar222;
  auVar74._0_4_ = auVar80._0_4_ * fVar212;
  auVar74._8_4_ = auVar80._8_4_ * fVar223;
  auVar74._12_4_ = auVar80._12_4_ * fVar118;
  auVar74._16_4_ = auVar80._16_4_ * fVar119;
  auVar74._20_4_ = auVar80._20_4_ * fVar120;
  auVar74._24_4_ = auVar80._24_4_ * fVar121;
  auVar74._28_4_ = auVar73._28_4_;
  auVar43 = vfmadd231ps_fma(auVar83,auVar82,auVar75);
  auVar44 = vfmadd231ps_fma(auVar81,auVar82,auVar89);
  auVar52 = vfmadd231ps_fma(auVar74,auVar79,auVar82);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar91,auVar76);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar91,auVar88);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar78,auVar91);
  auVar248._4_4_ = fVar131;
  auVar248._0_4_ = fVar131;
  auVar248._8_4_ = fVar131;
  auVar248._12_4_ = fVar131;
  auVar248._16_4_ = fVar131;
  auVar248._20_4_ = fVar131;
  auVar248._24_4_ = fVar131;
  auVar248._28_4_ = fVar131;
  auVar74 = ZEXT1632(CONCAT412(fVar132 * auVar61._12_4_,
                               CONCAT48(fVar132 * auVar61._8_4_,
                                        CONCAT44(fVar132 * auVar61._4_4_,fVar131))));
  auVar81 = vpermps_avx2(auVar258,auVar74);
  auVar74 = vpermps_avx512vl(auVar72,auVar74);
  fVar132 = auVar74._0_4_;
  fVar212 = auVar74._4_4_;
  auVar82._4_4_ = fVar212 * auVar87._4_4_;
  auVar82._0_4_ = fVar132 * auVar87._0_4_;
  fVar222 = auVar74._8_4_;
  auVar82._8_4_ = fVar222 * auVar87._8_4_;
  fVar223 = auVar74._12_4_;
  auVar82._12_4_ = fVar223 * auVar87._12_4_;
  fVar118 = auVar74._16_4_;
  auVar82._16_4_ = fVar118 * auVar87._16_4_;
  fVar119 = auVar74._20_4_;
  auVar82._20_4_ = fVar119 * auVar87._20_4_;
  fVar120 = auVar74._24_4_;
  auVar82._24_4_ = fVar120 * auVar87._24_4_;
  auVar82._28_4_ = fVar111;
  auVar72._4_4_ = auVar77._4_4_ * fVar212;
  auVar72._0_4_ = auVar77._0_4_ * fVar132;
  auVar72._8_4_ = auVar77._8_4_ * fVar222;
  auVar72._12_4_ = auVar77._12_4_ * fVar223;
  auVar72._16_4_ = auVar77._16_4_ * fVar118;
  auVar72._20_4_ = auVar77._20_4_ * fVar119;
  auVar72._24_4_ = auVar77._24_4_ * fVar120;
  auVar72._28_4_ = auVar87._28_4_;
  auVar77._4_4_ = auVar80._4_4_ * fVar212;
  auVar77._0_4_ = auVar80._0_4_ * fVar132;
  auVar77._8_4_ = auVar80._8_4_ * fVar222;
  auVar77._12_4_ = auVar80._12_4_ * fVar223;
  auVar77._16_4_ = auVar80._16_4_ * fVar118;
  auVar77._20_4_ = auVar80._20_4_ * fVar119;
  auVar77._24_4_ = auVar80._24_4_ * fVar120;
  auVar77._28_4_ = auVar74._28_4_;
  auVar51 = vfmadd231ps_fma(auVar82,auVar81,auVar75);
  auVar58 = vfmadd231ps_fma(auVar72,auVar81,auVar89);
  auVar55 = vfmadd231ps_fma(auVar77,auVar81,auVar79);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar248,auVar76);
  auVar61 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar248,auVar88);
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar248,auVar78);
  auVar76 = vandps_avx(ZEXT1632(auVar43),auVar92);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar190._16_4_ = 0x219392ef;
  auVar190._20_4_ = 0x219392ef;
  auVar190._24_4_ = 0x219392ef;
  auVar190._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar76,auVar190,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar73._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar43._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar43._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar43._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar43._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar76 = vandps_avx(ZEXT1632(auVar44),auVar92);
  uVar33 = vcmpps_avx512vl(auVar76,auVar190,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar84._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar44._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar44._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar44._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar44._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar76 = vandps_avx(ZEXT1632(auVar52),auVar92);
  uVar33 = vcmpps_avx512vl(auVar76,auVar190,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar76._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar158._8_4_ = 0x3f800000;
  auVar158._0_8_ = 0x3f8000003f800000;
  auVar158._12_4_ = 0x3f800000;
  auVar158._16_4_ = 0x3f800000;
  auVar158._20_4_ = 0x3f800000;
  auVar158._24_4_ = 0x3f800000;
  auVar158._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar73,auVar75,auVar158);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar84);
  auVar44 = vfnmadd213ps_fma(auVar84,auVar75,auVar158);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar76);
  auVar52 = vfnmadd213ps_fma(auVar76,auVar75,auVar158);
  auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar75,auVar75);
  fVar132 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar144._4_4_ = fVar132;
  auVar144._0_4_ = fVar132;
  auVar144._8_4_ = fVar132;
  auVar144._12_4_ = fVar132;
  auVar144._16_4_ = fVar132;
  auVar144._20_4_ = fVar132;
  auVar144._24_4_ = fVar132;
  auVar144._28_4_ = fVar132;
  auVar76 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 7 + 6));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0xb + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 9 + 6));
  auVar51 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar87);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0xd + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar58 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x12 + 6));
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar33 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 2 + uVar33 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar55 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 + 6));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x18 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar56 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x1d + 6));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 + (ulong)(byte)PVar6 * 0x20 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar57 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar6 * 0x20 - uVar30) + 6));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x23 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar59 = vfmadd213ps_fma(auVar75,auVar144,auVar76);
  auVar76 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar60));
  auVar78._4_4_ = auVar43._4_4_ * auVar76._4_4_;
  auVar78._0_4_ = auVar43._0_4_ * auVar76._0_4_;
  auVar78._8_4_ = auVar43._8_4_ * auVar76._8_4_;
  auVar78._12_4_ = auVar43._12_4_ * auVar76._12_4_;
  auVar78._16_4_ = auVar76._16_4_ * 0.0;
  auVar78._20_4_ = auVar76._20_4_ * 0.0;
  auVar78._24_4_ = auVar76._24_4_ * 0.0;
  auVar78._28_4_ = auVar76._28_4_;
  auVar76 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar60));
  auVar90._0_4_ = auVar43._0_4_ * auVar76._0_4_;
  auVar90._4_4_ = auVar43._4_4_ * auVar76._4_4_;
  auVar90._8_4_ = auVar43._8_4_ * auVar76._8_4_;
  auVar90._12_4_ = auVar43._12_4_ * auVar76._12_4_;
  auVar90._16_4_ = auVar76._16_4_ * 0.0;
  auVar90._20_4_ = auVar76._20_4_ * 0.0;
  auVar90._24_4_ = auVar76._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar76 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar61));
  auVar79._4_4_ = auVar44._4_4_ * auVar76._4_4_;
  auVar79._0_4_ = auVar44._0_4_ * auVar76._0_4_;
  auVar79._8_4_ = auVar44._8_4_ * auVar76._8_4_;
  auVar79._12_4_ = auVar44._12_4_ * auVar76._12_4_;
  auVar79._16_4_ = auVar76._16_4_ * 0.0;
  auVar79._20_4_ = auVar76._20_4_ * 0.0;
  auVar79._24_4_ = auVar76._24_4_ * 0.0;
  auVar79._28_4_ = auVar76._28_4_;
  auVar76 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar61));
  auVar86._0_4_ = auVar44._0_4_ * auVar76._0_4_;
  auVar86._4_4_ = auVar44._4_4_ * auVar76._4_4_;
  auVar86._8_4_ = auVar44._8_4_ * auVar76._8_4_;
  auVar86._12_4_ = auVar44._12_4_ * auVar76._12_4_;
  auVar86._16_4_ = auVar76._16_4_ * 0.0;
  auVar86._20_4_ = auVar76._20_4_ * 0.0;
  auVar86._24_4_ = auVar76._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar76 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar62));
  auVar80._4_4_ = auVar52._4_4_ * auVar76._4_4_;
  auVar80._0_4_ = auVar52._0_4_ * auVar76._0_4_;
  auVar80._8_4_ = auVar52._8_4_ * auVar76._8_4_;
  auVar80._12_4_ = auVar52._12_4_ * auVar76._12_4_;
  auVar80._16_4_ = auVar76._16_4_ * 0.0;
  auVar80._20_4_ = auVar76._20_4_ * 0.0;
  auVar80._24_4_ = auVar76._24_4_ * 0.0;
  auVar80._28_4_ = auVar76._28_4_;
  auVar76 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar62));
  auVar85._0_4_ = auVar52._0_4_ * auVar76._0_4_;
  auVar85._4_4_ = auVar52._4_4_ * auVar76._4_4_;
  auVar85._8_4_ = auVar52._8_4_ * auVar76._8_4_;
  auVar85._12_4_ = auVar52._12_4_ * auVar76._12_4_;
  auVar85._16_4_ = auVar76._16_4_ * 0.0;
  auVar85._20_4_ = auVar76._20_4_ * 0.0;
  auVar85._24_4_ = auVar76._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar76 = vpminsd_avx2(auVar78,auVar90);
  auVar75 = vpminsd_avx2(auVar79,auVar86);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx2(auVar80,auVar85);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar87._4_4_ = uVar112;
  auVar87._0_4_ = uVar112;
  auVar87._8_4_ = uVar112;
  auVar87._12_4_ = uVar112;
  auVar87._16_4_ = uVar112;
  auVar87._20_4_ = uVar112;
  auVar87._24_4_ = uVar112;
  auVar87._28_4_ = uVar112;
  auVar75 = vmaxps_avx512vl(auVar75,auVar87);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75._8_4_ = 0x3f7ffffa;
  auVar75._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar75._12_4_ = 0x3f7ffffa;
  auVar75._16_4_ = 0x3f7ffffa;
  auVar75._20_4_ = 0x3f7ffffa;
  auVar75._24_4_ = 0x3f7ffffa;
  auVar75._28_4_ = 0x3f7ffffa;
  local_3e0 = vmulps_avx512vl(auVar76,auVar75);
  auVar76 = vpmaxsd_avx2(auVar78,auVar90);
  auVar75 = vpmaxsd_avx2(auVar79,auVar86);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx2(auVar80,auVar85);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar88._4_4_ = uVar112;
  auVar88._0_4_ = uVar112;
  auVar88._8_4_ = uVar112;
  auVar88._12_4_ = uVar112;
  auVar88._16_4_ = uVar112;
  auVar88._20_4_ = uVar112;
  auVar88._24_4_ = uVar112;
  auVar88._28_4_ = uVar112;
  auVar75 = vminps_avx512vl(auVar75,auVar88);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar89);
  auVar75 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar75,_DAT_01fe9900);
  uVar15 = vcmpps_avx512vl(local_3e0,auVar76,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) == 0) {
    return false;
  }
  uVar33 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  auVar117 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar117);
  auVar43 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar117 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar259 = ZEXT1664(auVar43);
LAB_01e29329:
  lVar32 = 0;
  for (uVar30 = uVar33; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  fVar132 = (pGVar9->time_range).lower;
  fVar118 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar132) / ((pGVar9->time_range).upper - fVar132));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
  auVar44 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar43 = vminss_avx(auVar43,auVar44);
  auVar45 = vmaxss_avx512f(auVar117._0_16_,auVar43);
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar32 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar35 = (long)(int)auVar45._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar35);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar35);
  auVar43 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar30);
  lVar32 = uVar30 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar32);
  lVar1 = uVar30 + 2;
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar30 + 3;
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar35);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar35);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar30);
  auVar55 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar32);
  auVar56 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar35);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar35);
  auVar59 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar30);
  auVar60 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar32);
  auVar61 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar62 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  auVar117 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar117);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar35);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar35);
  auVar63 = *(undefined1 (*) [16])(lVar12 + uVar30 * lVar11);
  auVar64 = *(undefined1 (*) [16])(lVar12 + lVar32 * lVar11);
  auVar122 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  fVar118 = fVar118 - auVar45._0_4_;
  auVar117._0_16_ = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
  auVar45 = vmulps_avx512vl(auVar51,auVar117._0_16_);
  auVar69._8_4_ = 0x3e2aaaab;
  auVar69._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar69._12_4_ = 0x3e2aaaab;
  auVar46 = vfmadd213ps_avx512vl(auVar69,auVar52,auVar45);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar47);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar69);
  auVar67 = auVar259._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar67);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar44,auVar117._0_16_);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar43,auVar67);
  auVar48 = vmulps_avx512vl(auVar57,auVar117._0_16_);
  auVar49 = vfmadd213ps_avx512vl(auVar69,auVar56,auVar48);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar47);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar58,auVar69);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar67);
  auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar55,auVar117._0_16_);
  auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar58,auVar67);
  auVar50 = vmulps_avx512vl(auVar51,auVar69);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar52,auVar47);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar69);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar117._0_16_);
  auVar51 = vmulps_avx512vl(auVar51,auVar67);
  auVar52 = vfmadd231ps_avx512vl(auVar51,auVar117._0_16_,auVar52);
  auVar44 = vfnmadd231ps_avx512vl(auVar52,auVar67,auVar44);
  auVar53 = vfnmadd231ps_avx512vl(auVar44,auVar117._0_16_,auVar43);
  auVar54._0_4_ = auVar57._0_4_ * 0.16666667;
  auVar54._4_4_ = auVar57._4_4_ * 0.16666667;
  auVar54._8_4_ = auVar57._8_4_ * 0.16666667;
  auVar54._12_4_ = auVar57._12_4_ * 0.16666667;
  auVar43 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar47);
  auVar43 = vfmadd231ps_fma(auVar43,auVar55,auVar69);
  auVar54 = vfmadd231ps_avx512vl(auVar43,auVar58,auVar117._0_16_);
  auVar43 = vmulps_avx512vl(auVar57,auVar67);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar117._0_16_,auVar56);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar67,auVar55);
  auVar55 = vfnmadd231ps_avx512vl(auVar43,auVar117._0_16_,auVar58);
  auVar43 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar44 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  fVar121 = auVar45._0_4_;
  auVar70._0_4_ = fVar121 * auVar44._0_4_;
  fVar131 = auVar45._4_4_;
  auVar70._4_4_ = fVar131 * auVar44._4_4_;
  fVar140 = auVar45._8_4_;
  auVar70._8_4_ = fVar140 * auVar44._8_4_;
  fVar224 = auVar45._12_4_;
  auVar70._12_4_ = fVar224 * auVar44._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar70,auVar43,auVar49);
  auVar52 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar161._0_4_ = fVar121 * auVar44._0_4_;
  auVar161._4_4_ = fVar131 * auVar44._4_4_;
  auVar161._8_4_ = fVar140 * auVar44._8_4_;
  auVar161._12_4_ = fVar224 * auVar44._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar161,auVar43,auVar48);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar44 = vshufps_avx(auVar54,auVar54,0xc9);
  fVar111 = auVar53._0_4_;
  auVar183._0_4_ = auVar44._0_4_ * fVar111;
  fVar212 = auVar53._4_4_;
  auVar183._4_4_ = auVar44._4_4_ * fVar212;
  fVar222 = auVar53._8_4_;
  auVar183._8_4_ = auVar44._8_4_ * fVar222;
  fVar223 = auVar53._12_4_;
  auVar183._12_4_ = auVar44._12_4_ * fVar223;
  auVar44 = vfmsub231ps_fma(auVar183,auVar43,auVar54);
  auVar58 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar184._0_4_ = auVar44._0_4_ * fVar111;
  auVar184._4_4_ = auVar44._4_4_ * fVar212;
  auVar184._8_4_ = auVar44._8_4_ * fVar222;
  auVar184._12_4_ = auVar44._12_4_ * fVar223;
  auVar43 = vfmsub231ps_fma(auVar184,auVar43,auVar55);
  auVar55 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar259._4_60_ = auVar117._4_60_;
  auVar259._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar117._0_16_,auVar259._0_16_);
  auVar56 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar44);
  auVar44 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  auVar44 = vaddss_avx512f(auVar56,auVar44);
  auVar192._0_4_ = auVar44._0_4_;
  auVar192._4_4_ = auVar192._0_4_;
  auVar192._8_4_ = auVar192._0_4_;
  auVar192._12_4_ = auVar192._0_4_;
  auVar56 = vmulps_avx512vl(auVar52,auVar192);
  auVar44 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar57,auVar51);
  fVar132 = auVar44._0_4_;
  auVar71._0_4_ = fVar132 * auVar52._0_4_;
  auVar71._4_4_ = fVar132 * auVar52._4_4_;
  auVar71._8_4_ = fVar132 * auVar52._8_4_;
  auVar71._12_4_ = fVar132 * auVar52._12_4_;
  auVar52 = vsubps_avx(auVar51,auVar71);
  auVar44 = vrcp14ss_avx512f(auVar117._0_16_,auVar259._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar119 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar264._16_48_ = auVar117._16_48_;
  auVar264._0_16_ = auVar117._0_16_;
  auVar263._4_60_ = auVar264._4_60_;
  auVar263._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar117._0_16_,auVar263._0_16_);
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar132 = auVar44._0_4_;
  fVar132 = auVar51._0_4_ + auVar57._0_4_ * fVar132 * fVar132 * fVar132;
  auVar193._0_4_ = fVar132 * auVar58._0_4_;
  auVar193._4_4_ = fVar132 * auVar58._4_4_;
  auVar193._8_4_ = fVar132 * auVar58._8_4_;
  auVar193._12_4_ = fVar132 * auVar58._12_4_;
  auVar44 = vdpps_avx(auVar58,auVar55,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar51,auVar55);
  fVar120 = auVar44._0_4_;
  auVar48._0_4_ = fVar120 * auVar58._0_4_;
  auVar48._4_4_ = fVar120 * auVar58._4_4_;
  auVar48._8_4_ = fVar120 * auVar58._8_4_;
  auVar48._12_4_ = fVar120 * auVar58._12_4_;
  auVar44 = vsubps_avx(auVar51,auVar48);
  auVar51 = vrcp14ss_avx512f(auVar117._0_16_,auVar263._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar120 = auVar51._0_4_ * auVar43._0_4_;
  auVar51 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar58 = vmulps_avx512vl(auVar51,auVar56);
  auVar55 = vsubps_avx512vl(auVar46,auVar58);
  auVar43 = vshufps_avx(auVar45,auVar45,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar56);
  auVar66._0_4_ = auVar43._0_4_ + auVar51._0_4_ * auVar192._0_4_ * fVar119 * auVar52._0_4_;
  auVar66._4_4_ = auVar43._4_4_ + auVar51._4_4_ * auVar192._0_4_ * fVar119 * auVar52._4_4_;
  auVar66._8_4_ = auVar43._8_4_ + auVar51._8_4_ * auVar192._0_4_ * fVar119 * auVar52._8_4_;
  auVar66._12_4_ = auVar43._12_4_ + auVar51._12_4_ * auVar192._0_4_ * fVar119 * auVar52._12_4_;
  auVar43 = vsubps_avx(auVar45,auVar66);
  auVar56 = vaddps_avx512vl(auVar46,auVar58);
  auVar52 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar237._0_4_ = auVar193._0_4_ * auVar52._0_4_;
  auVar237._4_4_ = auVar193._4_4_ * auVar52._4_4_;
  auVar237._8_4_ = auVar193._8_4_ * auVar52._8_4_;
  auVar237._12_4_ = auVar193._12_4_ * auVar52._12_4_;
  auVar57 = vsubps_avx512vl(auVar50,auVar237);
  auVar51 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar51 = vmulps_avx512vl(auVar51,auVar193);
  auVar146._0_4_ = auVar51._0_4_ + auVar52._0_4_ * fVar132 * auVar44._0_4_ * fVar120;
  auVar146._4_4_ = auVar51._4_4_ + auVar52._4_4_ * fVar132 * auVar44._4_4_ * fVar120;
  auVar146._8_4_ = auVar51._8_4_ + auVar52._8_4_ * fVar132 * auVar44._8_4_ * fVar120;
  auVar146._12_4_ = auVar51._12_4_ + auVar52._12_4_ * fVar132 * auVar44._12_4_ * fVar120;
  auVar44 = vsubps_avx(auVar53,auVar146);
  auVar45 = vaddps_avx512vl(auVar50,auVar237);
  auVar172._0_4_ = auVar55._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar172._4_4_ = auVar55._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar172._8_4_ = auVar55._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar172._12_4_ = auVar55._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar147._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar147._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar147._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar147._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar57,auVar147);
  auVar148._0_4_ = (fVar121 + auVar66._0_4_) * 0.33333334;
  auVar148._4_4_ = (fVar131 + auVar66._4_4_) * 0.33333334;
  auVar148._8_4_ = (fVar140 + auVar66._8_4_) * 0.33333334;
  auVar148._12_4_ = (fVar224 + auVar66._12_4_) * 0.33333334;
  auVar46 = vaddps_avx512vl(auVar56,auVar148);
  auVar162._0_4_ = (fVar111 + auVar146._0_4_) * 0.33333334;
  auVar162._4_4_ = (fVar212 + auVar146._4_4_) * 0.33333334;
  auVar162._8_4_ = (fVar222 + auVar146._8_4_) * 0.33333334;
  auVar162._12_4_ = (fVar223 + auVar146._12_4_) * 0.33333334;
  auVar48 = vsubps_avx512vl(auVar45,auVar162);
  auVar43 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar44 = vmulps_avx512vl(auVar62,auVar117._0_16_);
  auVar52 = vfmadd213ps_avx512vl(auVar69,auVar61,auVar44);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar47);
  auVar49 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar69);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar67);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar60,auVar117._0_16_);
  auVar50 = vfnmadd231ps_avx512vl(auVar44,auVar59,auVar67);
  auVar44 = vmulps_avx512vl(auVar43,auVar117._0_16_);
  auVar52 = vfmadd213ps_avx512vl(auVar69,auVar122,auVar44);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar64,auVar47);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar63,auVar69);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar122,auVar67);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar64,auVar117._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar44,auVar63,auVar67);
  auVar44 = vmulps_avx512vl(auVar62,auVar69);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar47);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar69);
  auVar53 = vfmadd231ps_avx512vl(auVar44,auVar59,auVar117._0_16_);
  auVar44 = vmulps_avx512vl(auVar62,auVar67);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar117._0_16_,auVar61);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar67,auVar60);
  auVar59 = vfnmadd231ps_avx512vl(auVar44,auVar117._0_16_,auVar59);
  auVar44 = vmulps_avx512vl(auVar43,auVar69);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar122,auVar47);
  auVar44 = vfmadd231ps_fma(auVar44,auVar64,auVar69);
  auVar60 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar117._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar67);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar117._0_16_,auVar122);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar67,auVar64);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar47);
  auVar61 = vfnmadd231ps_avx512vl(auVar43,auVar117._0_16_,auVar63);
  auVar43 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar44 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  fVar212 = auVar50._0_4_;
  auVar243._0_4_ = fVar212 * auVar44._0_4_;
  fVar222 = auVar50._4_4_;
  auVar243._4_4_ = fVar222 * auVar44._4_4_;
  fVar223 = auVar50._8_4_;
  auVar243._8_4_ = fVar223 * auVar44._8_4_;
  fVar119 = auVar50._12_4_;
  auVar243._12_4_ = fVar119 * auVar44._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar243,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar250._0_4_ = fVar212 * auVar44._0_4_;
  auVar250._4_4_ = fVar222 * auVar44._4_4_;
  auVar250._8_4_ = fVar223 * auVar44._8_4_;
  auVar250._12_4_ = fVar119 * auVar44._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar250,auVar43,auVar51);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar44 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar43 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar43 = vmulps_avx512vl(auVar59,auVar43);
  auVar43 = vfmsub231ps_avx512vl(auVar43,auVar44,auVar60);
  auVar60 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar62 = vmulps_avx512vl(auVar59,auVar62);
  auVar44 = vfmsub231ps_avx512vl(auVar62,auVar44,auVar61);
  auVar61 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar261._16_48_ = auVar117._16_48_;
  auVar261._0_16_ = auVar117._0_16_;
  auVar260._4_60_ = auVar261._4_60_;
  auVar260._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar117._0_16_,auVar260._0_16_);
  auVar62 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar63 = vmulss_avx512f(auVar63,auVar44);
  auVar44 = vmulss_avx512f(auVar44,auVar44);
  auVar44 = vmulss_avx512f(auVar63,auVar44);
  auVar44 = vaddss_avx512f(auVar62,auVar44);
  auVar62 = vbroadcastss_avx512vl(auVar44);
  auVar63 = vmulps_avx512vl(auVar52,auVar62);
  auVar44 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar64 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar64,auVar51);
  fVar132 = auVar44._0_4_;
  auVar149._0_4_ = auVar52._0_4_ * fVar132;
  auVar149._4_4_ = auVar52._4_4_ * fVar132;
  auVar149._8_4_ = auVar52._8_4_ * fVar132;
  auVar149._12_4_ = auVar52._12_4_ * fVar132;
  auVar44 = vsubps_avx(auVar51,auVar149);
  auVar52 = vrcp14ss_avx512f(auVar117._0_16_,auVar260._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar52,ZEXT416(0x40000000));
  fVar132 = auVar52._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar64._0_4_ = fVar132 * auVar44._0_4_;
  auVar64._4_4_ = fVar132 * auVar44._4_4_;
  auVar64._8_4_ = fVar132 * auVar44._8_4_;
  auVar64._12_4_ = fVar132 * auVar44._12_4_;
  auVar52 = vmulps_avx512vl(auVar62,auVar64);
  auVar108._16_48_ = auVar117._16_48_;
  auVar108._0_16_ = auVar117._0_16_;
  auVar262._4_60_ = auVar108._4_60_;
  auVar262._0_4_ = auVar43._0_4_;
  auVar44 = vrsqrt14ss_avx512f(auVar117._0_16_,auVar262._0_16_);
  auVar51 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar263 = ZEXT464(0x3f800000);
  auVar62 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar62 = vmulss_avx512f(auVar62,auVar44);
  auVar44 = vmulss_avx512f(auVar62,ZEXT416((uint)(auVar44._0_4_ * auVar44._0_4_)));
  fVar132 = auVar51._0_4_ + auVar44._0_4_;
  auVar251._0_4_ = auVar60._0_4_ * fVar132;
  auVar251._4_4_ = auVar60._4_4_ * fVar132;
  auVar251._8_4_ = auVar60._8_4_ * fVar132;
  auVar251._12_4_ = auVar60._12_4_ * fVar132;
  auVar44 = vdpps_avx(auVar60,auVar61,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar51 = vmulps_avx512vl(auVar51,auVar61);
  fVar111 = auVar44._0_4_;
  auVar163._0_4_ = auVar60._0_4_ * fVar111;
  auVar163._4_4_ = auVar60._4_4_ * fVar111;
  auVar163._8_4_ = auVar60._8_4_ * fVar111;
  auVar163._12_4_ = auVar60._12_4_ * fVar111;
  auVar44 = vsubps_avx(auVar51,auVar163);
  auVar51 = vrcp14ss_avx512f(auVar117._0_16_,auVar262._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar111 = auVar43._0_4_ * auVar51._0_4_;
  auVar51 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar60 = vmulps_avx512vl(auVar51,auVar63);
  auVar61 = vsubps_avx512vl(auVar49,auVar60);
  auVar43 = vshufps_avx(auVar50,auVar50,0xff);
  auVar43 = vmulps_avx512vl(auVar43,auVar63);
  auVar63._0_4_ = auVar43._0_4_ + auVar51._0_4_ * auVar52._0_4_;
  auVar63._4_4_ = auVar43._4_4_ + auVar51._4_4_ * auVar52._4_4_;
  auVar63._8_4_ = auVar43._8_4_ + auVar51._8_4_ * auVar52._8_4_;
  auVar63._12_4_ = auVar43._12_4_ + auVar51._12_4_ * auVar52._12_4_;
  auVar43 = vsubps_avx(auVar50,auVar63);
  auVar52 = vaddps_avx512vl(auVar49,auVar60);
  auVar51 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar228._0_4_ = auVar51._0_4_ * auVar251._0_4_;
  auVar228._4_4_ = auVar51._4_4_ * auVar251._4_4_;
  auVar228._8_4_ = auVar51._8_4_ * auVar251._8_4_;
  auVar228._12_4_ = auVar51._12_4_ * auVar251._12_4_;
  auVar60 = vsubps_avx512vl(auVar53,auVar228);
  auVar62 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar251);
  auVar150._0_4_ = auVar62._0_4_ + auVar51._0_4_ * fVar132 * auVar44._0_4_ * fVar111;
  auVar150._4_4_ = auVar62._4_4_ + auVar51._4_4_ * fVar132 * auVar44._4_4_ * fVar111;
  auVar150._8_4_ = auVar62._8_4_ + auVar51._8_4_ * fVar132 * auVar44._8_4_ * fVar111;
  auVar150._12_4_ = auVar62._12_4_ + auVar51._12_4_ * fVar132 * auVar44._12_4_ * fVar111;
  auVar44 = vsubps_avx(auVar59,auVar150);
  auVar51 = vaddps_avx512vl(auVar53,auVar228);
  auVar164._0_4_ = auVar61._0_4_ + auVar43._0_4_ * 0.33333334;
  auVar164._4_4_ = auVar61._4_4_ + auVar43._4_4_ * 0.33333334;
  auVar164._8_4_ = auVar61._8_4_ + auVar43._8_4_ * 0.33333334;
  auVar164._12_4_ = auVar61._12_4_ + auVar43._12_4_ * 0.33333334;
  auVar194._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar194._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar194._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar194._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar43 = vsubps_avx(auVar60,auVar194);
  auVar122._0_4_ = auVar52._0_4_ + (fVar212 + auVar63._0_4_) * 0.33333334;
  auVar122._4_4_ = auVar52._4_4_ + (fVar222 + auVar63._4_4_) * 0.33333334;
  auVar122._8_4_ = auVar52._8_4_ + (fVar223 + auVar63._8_4_) * 0.33333334;
  auVar122._12_4_ = auVar52._12_4_ + (fVar119 + auVar63._12_4_) * 0.33333334;
  auVar151._0_4_ = (auVar59._0_4_ + auVar150._0_4_) * 0.33333334;
  auVar151._4_4_ = (auVar59._4_4_ + auVar150._4_4_) * 0.33333334;
  auVar151._8_4_ = (auVar59._8_4_ + auVar150._8_4_) * 0.33333334;
  auVar151._12_4_ = (auVar59._12_4_ + auVar150._12_4_) * 0.33333334;
  auVar44 = vsubps_avx(auVar51,auVar151);
  auVar238._4_4_ = fVar118;
  auVar238._0_4_ = fVar118;
  auVar238._8_4_ = fVar118;
  auVar238._12_4_ = fVar118;
  auVar59 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar118));
  auVar252._0_4_ = auVar59._0_4_;
  auVar252._4_4_ = auVar252._0_4_;
  auVar252._8_4_ = auVar252._0_4_;
  auVar252._12_4_ = auVar252._0_4_;
  auVar59 = vmulps_avx512vl(auVar238,auVar61);
  auVar61 = vmulps_avx512vl(auVar238,auVar164);
  auVar43 = vmulps_avx512vl(auVar238,auVar43);
  auVar244._0_4_ = fVar118 * auVar60._0_4_;
  auVar244._4_4_ = fVar118 * auVar60._4_4_;
  auVar244._8_4_ = fVar118 * auVar60._8_4_;
  auVar244._12_4_ = fVar118 * auVar60._12_4_;
  local_540 = vfmadd231ps_avx512vl(auVar59,auVar252,auVar55);
  local_550 = vfmadd231ps_avx512vl(auVar61,auVar252,auVar172);
  local_560 = vfmadd231ps_avx512vl(auVar43,auVar252,auVar58);
  local_570 = vfmadd231ps_fma(auVar244,auVar252,auVar57);
  auVar43 = vmulps_avx512vl(auVar238,auVar52);
  auVar52 = vmulps_avx512vl(auVar238,auVar122);
  auVar44 = vmulps_avx512vl(auVar238,auVar44);
  auVar239._0_4_ = fVar118 * auVar51._0_4_;
  auVar239._4_4_ = fVar118 * auVar51._4_4_;
  auVar239._8_4_ = fVar118 * auVar51._8_4_;
  auVar239._12_4_ = fVar118 * auVar51._12_4_;
  _local_580 = vfmadd231ps_avx512vl(auVar43,auVar252,auVar56);
  _local_590 = vfmadd231ps_avx512vl(auVar52,auVar252,auVar46);
  _local_5a0 = vfmadd231ps_avx512vl(auVar44,auVar252,auVar48);
  _local_5b0 = vfmadd231ps_fma(auVar239,auVar252,auVar45);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_4c0 = vsubps_avx512vl(local_540,auVar43);
  uVar112 = local_4c0._0_4_;
  auVar45._4_4_ = uVar112;
  auVar45._0_4_ = uVar112;
  auVar45._8_4_ = uVar112;
  auVar45._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar52 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar132 = pre->ray_space[k].vz.field_0.m128[0];
  fVar111 = pre->ray_space[k].vz.field_0.m128[1];
  fVar212 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  auVar62._0_4_ = fVar132 * auVar52._0_4_;
  auVar62._4_4_ = fVar111 * auVar52._4_4_;
  auVar62._8_4_ = fVar212 * auVar52._8_4_;
  auVar62._12_4_ = fVar222 * auVar52._12_4_;
  auVar44 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar5,auVar44);
  auVar57 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar45);
  local_4d0 = vsubps_avx512vl(local_550,auVar43);
  uVar112 = local_4d0._0_4_;
  auVar50._4_4_ = uVar112;
  auVar50._0_4_ = uVar112;
  auVar50._8_4_ = uVar112;
  auVar50._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar52 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar46._0_4_ = fVar132 * auVar52._0_4_;
  auVar46._4_4_ = fVar111 * auVar52._4_4_;
  auVar46._8_4_ = fVar212 * auVar52._8_4_;
  auVar46._12_4_ = fVar222 * auVar52._12_4_;
  auVar44 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar5,auVar44);
  auVar59 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar50);
  local_4e0 = vsubps_avx512vl(local_560,auVar43);
  uVar112 = local_4e0._0_4_;
  auVar53._4_4_ = uVar112;
  auVar53._0_4_ = uVar112;
  auVar53._8_4_ = uVar112;
  auVar53._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar52 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar185._0_4_ = auVar52._0_4_ * fVar132;
  auVar185._4_4_ = auVar52._4_4_ * fVar111;
  auVar185._8_4_ = auVar52._8_4_ * fVar212;
  auVar185._12_4_ = auVar52._12_4_ * fVar222;
  auVar44 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar44);
  auVar60 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar53);
  local_4f0 = vsubps_avx(local_570,auVar43);
  uVar112 = local_4f0._0_4_;
  auVar67._4_4_ = uVar112;
  auVar67._0_4_ = uVar112;
  auVar67._8_4_ = uVar112;
  auVar67._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar52 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar195._0_4_ = auVar52._0_4_ * fVar132;
  auVar195._4_4_ = auVar52._4_4_ * fVar111;
  auVar195._8_4_ = auVar52._8_4_ * fVar212;
  auVar195._12_4_ = auVar52._12_4_ * fVar222;
  auVar44 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar44);
  auVar61 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar67);
  local_500 = vsubps_avx512vl(_local_580,auVar43);
  uVar112 = local_500._0_4_;
  auVar68._4_4_ = uVar112;
  auVar68._0_4_ = uVar112;
  auVar68._8_4_ = uVar112;
  auVar68._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_500,local_500,0x55);
  auVar52 = vshufps_avx(local_500,local_500,0xaa);
  auVar206._0_4_ = auVar52._0_4_ * fVar132;
  auVar206._4_4_ = auVar52._4_4_ * fVar111;
  auVar206._8_4_ = auVar52._8_4_ * fVar212;
  auVar206._12_4_ = auVar52._12_4_ * fVar222;
  auVar44 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar44);
  auVar62 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar68);
  local_510 = vsubps_avx512vl(_local_590,auVar43);
  uVar112 = local_510._0_4_;
  auVar133._4_4_ = uVar112;
  auVar133._0_4_ = uVar112;
  auVar133._8_4_ = uVar112;
  auVar133._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_510,local_510,0x55);
  auVar52 = vshufps_avx(local_510,local_510,0xaa);
  auVar213._0_4_ = auVar52._0_4_ * fVar132;
  auVar213._4_4_ = auVar52._4_4_ * fVar111;
  auVar213._8_4_ = auVar52._8_4_ * fVar212;
  auVar213._12_4_ = auVar52._12_4_ * fVar222;
  auVar44 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar5,auVar44);
  auVar63 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar133);
  local_520 = vsubps_avx512vl(_local_5a0,auVar43);
  uVar112 = local_520._0_4_;
  auVar65._4_4_ = uVar112;
  auVar65._0_4_ = uVar112;
  auVar65._8_4_ = uVar112;
  auVar65._12_4_ = uVar112;
  auVar44 = vshufps_avx(local_520,local_520,0x55);
  auVar52 = vshufps_avx(local_520,local_520,0xaa);
  auVar229._0_4_ = auVar52._0_4_ * fVar132;
  auVar229._4_4_ = auVar52._4_4_ * fVar111;
  auVar229._8_4_ = auVar52._8_4_ * fVar212;
  auVar229._12_4_ = auVar52._12_4_ * fVar222;
  auVar44 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar44);
  auVar64 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar65);
  local_530 = vsubps_avx(_local_5b0,auVar43);
  uVar112 = local_530._0_4_;
  auVar49._4_4_ = uVar112;
  auVar49._0_4_ = uVar112;
  auVar49._8_4_ = uVar112;
  auVar49._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_530,local_530,0x55);
  auVar44 = vshufps_avx(local_530,local_530,0xaa);
  auVar165._0_4_ = fVar132 * auVar44._0_4_;
  auVar165._4_4_ = fVar111 * auVar44._4_4_;
  auVar165._8_4_ = fVar212 * auVar44._8_4_;
  auVar165._12_4_ = fVar222 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar5,auVar43);
  auVar122 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar49);
  auVar56 = vmovlhps_avx512f(auVar57,auVar62);
  auVar52 = vmovlhps_avx(auVar59,auVar63);
  auVar51 = vmovlhps_avx(auVar60,auVar64);
  auVar58 = vmovlhps_avx(auVar61,auVar122);
  auVar44 = vminps_avx512vl(auVar56,auVar52);
  auVar55 = vmaxps_avx512vl(auVar56,auVar52);
  auVar43 = vminps_avx(auVar51,auVar58);
  auVar44 = vminps_avx(auVar44,auVar43);
  auVar43 = vmaxps_avx(auVar51,auVar58);
  auVar43 = vmaxps_avx(auVar55,auVar43);
  auVar55 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar44 = vandps_avx512vl(auVar44,auVar47);
  auVar43 = vandps_avx512vl(auVar43,auVar47);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  fVar132 = auVar43._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar57);
  auVar55 = vmovddup_avx512vl(auVar59);
  auVar47._0_8_ = auVar60._0_8_;
  auVar47._8_8_ = auVar47._0_8_;
  auVar196._0_8_ = auVar61._0_8_;
  auVar196._8_8_ = auVar196._0_8_;
  local_480 = vbroadcastss_avx512vl(ZEXT416((uint)fVar132));
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  auVar43 = vxorps_avx512vl(local_480._0_16_,auVar61);
  local_3c0 = auVar43._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  bVar37 = false;
  uVar30 = 0;
  uVar38 = *(uint *)(ray + k * 4 + 0xc0);
  local_490 = vsubps_avx512vl(auVar52,auVar56);
  local_4a0 = vsubps_avx(auVar51,auVar52);
  local_4b0 = vsubps_avx(auVar58,auVar51);
  local_5c0 = vsubps_avx512vl(_local_580,local_540);
  local_5d0 = vsubps_avx512vl(_local_590,local_550);
  local_5e0 = vsubps_avx512vl(_local_5a0,local_560);
  _local_5f0 = vsubps_avx(_local_5b0,local_570);
  auVar117 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar117);
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar95._32_32_ = auVar117._32_32_;
  auVar60 = auVar43;
  do {
    auVar57 = vshufps_avx(auVar60,auVar60,0x50);
    auVar245._8_4_ = 0x3f800000;
    auVar245._0_8_ = 0x3f8000003f800000;
    auVar245._12_4_ = 0x3f800000;
    auVar249._16_4_ = 0x3f800000;
    auVar249._0_16_ = auVar245;
    auVar249._20_4_ = 0x3f800000;
    auVar249._24_4_ = 0x3f800000;
    auVar249._28_4_ = 0x3f800000;
    auVar59 = vsubps_avx(auVar245,auVar57);
    fVar111 = auVar57._0_4_;
    fVar118 = auVar62._0_4_;
    auVar141._0_4_ = fVar118 * fVar111;
    fVar212 = auVar57._4_4_;
    fVar119 = auVar62._4_4_;
    auVar141._4_4_ = fVar119 * fVar212;
    fVar222 = auVar57._8_4_;
    auVar141._8_4_ = fVar118 * fVar222;
    fVar223 = auVar57._12_4_;
    auVar141._12_4_ = fVar119 * fVar223;
    fVar120 = auVar63._0_4_;
    auVar152._0_4_ = fVar120 * fVar111;
    fVar121 = auVar63._4_4_;
    auVar152._4_4_ = fVar121 * fVar212;
    auVar152._8_4_ = fVar120 * fVar222;
    auVar152._12_4_ = fVar121 * fVar223;
    fVar131 = auVar64._0_4_;
    auVar166._0_4_ = fVar131 * fVar111;
    fVar140 = auVar64._4_4_;
    auVar166._4_4_ = fVar140 * fVar212;
    auVar166._8_4_ = fVar131 * fVar222;
    auVar166._12_4_ = fVar140 * fVar223;
    fVar227 = auVar122._0_4_;
    auVar124._0_4_ = fVar227 * fVar111;
    fVar236 = auVar122._4_4_;
    auVar124._4_4_ = fVar236 * fVar212;
    auVar124._8_4_ = fVar227 * fVar222;
    auVar124._12_4_ = fVar236 * fVar223;
    auVar45 = vfmadd231ps_avx512vl(auVar141,auVar59,auVar44);
    auVar46 = vfmadd231ps_avx512vl(auVar152,auVar59,auVar55);
    auVar61 = vfmadd231ps_fma(auVar166,auVar59,auVar47);
    auVar59 = vfmadd231ps_fma(auVar124,auVar196,auVar59);
    auVar57 = vmovshdup_avx(auVar43);
    fVar212 = auVar43._0_4_;
    fVar111 = (auVar57._0_4_ - fVar212) * 0.04761905;
    auVar191._4_4_ = fVar212;
    auVar191._0_4_ = fVar212;
    auVar191._8_4_ = fVar212;
    auVar191._12_4_ = fVar212;
    auVar191._16_4_ = fVar212;
    auVar191._20_4_ = fVar212;
    auVar191._24_4_ = fVar212;
    auVar191._28_4_ = fVar212;
    auVar138._0_8_ = auVar57._0_8_;
    auVar138._8_8_ = auVar138._0_8_;
    auVar138._16_8_ = auVar138._0_8_;
    auVar138._24_8_ = auVar138._0_8_;
    auVar75 = vsubps_avx(auVar138,auVar191);
    uVar112 = auVar45._0_4_;
    auVar139._4_4_ = uVar112;
    auVar139._0_4_ = uVar112;
    auVar139._8_4_ = uVar112;
    auVar139._12_4_ = uVar112;
    auVar139._16_4_ = uVar112;
    auVar139._20_4_ = uVar112;
    auVar139._24_4_ = uVar112;
    auVar139._28_4_ = uVar112;
    auVar209._8_4_ = 1;
    auVar209._0_8_ = 0x100000001;
    auVar209._12_4_ = 1;
    auVar209._16_4_ = 1;
    auVar209._20_4_ = 1;
    auVar209._24_4_ = 1;
    auVar209._28_4_ = 1;
    auVar88 = ZEXT1632(auVar45);
    auVar87 = vpermps_avx2(auVar209,auVar88);
    auVar77 = vbroadcastss_avx512vl(auVar46);
    auVar89 = ZEXT1632(auVar46);
    auVar78 = vpermps_avx512vl(auVar209,auVar89);
    auVar79 = vbroadcastss_avx512vl(auVar61);
    auVar84 = ZEXT1632(auVar61);
    auVar80 = vpermps_avx512vl(auVar209,auVar84);
    auVar81 = vbroadcastss_avx512vl(auVar59);
    auVar85 = ZEXT1632(auVar59);
    auVar74 = vpermps_avx512vl(auVar209,auVar85);
    auVar210._4_4_ = fVar111;
    auVar210._0_4_ = fVar111;
    auVar210._8_4_ = fVar111;
    auVar210._12_4_ = fVar111;
    auVar210._16_4_ = fVar111;
    auVar210._20_4_ = fVar111;
    auVar210._24_4_ = fVar111;
    auVar210._28_4_ = fVar111;
    auVar82 = vpermps_avx512vl(auVar76,auVar88);
    auVar179._8_4_ = 3;
    auVar179._0_8_ = 0x300000003;
    auVar179._12_4_ = 3;
    auVar179._16_4_ = 3;
    auVar179._20_4_ = 3;
    auVar179._24_4_ = 3;
    auVar179._28_4_ = 3;
    auVar83 = vpermps_avx512vl(auVar179,auVar88);
    auVar72 = vpermps_avx512vl(auVar76,auVar89);
    auVar88 = vpermps_avx2(auVar179,auVar89);
    auVar73 = vpermps_avx512vl(auVar76,auVar84);
    auVar89 = vpermps_avx2(auVar179,auVar84);
    auVar84 = vpermps_avx512vl(auVar76,auVar85);
    auVar85 = vpermps_avx512vl(auVar179,auVar85);
    auVar57 = vfmadd132ps_fma(auVar75,auVar191,_DAT_01faff20);
    auVar76 = vsubps_avx(auVar249,ZEXT1632(auVar57));
    auVar75 = vmulps_avx512vl(auVar77,ZEXT1632(auVar57));
    auVar90 = ZEXT1632(auVar57);
    auVar86 = vmulps_avx512vl(auVar78,auVar90);
    auVar59 = vfmadd231ps_fma(auVar75,auVar76,auVar139);
    auVar61 = vfmadd231ps_fma(auVar86,auVar76,auVar87);
    auVar75 = vmulps_avx512vl(auVar79,auVar90);
    auVar86 = vmulps_avx512vl(auVar80,auVar90);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar76,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar86,auVar76,auVar78);
    auVar78 = vmulps_avx512vl(auVar81,auVar90);
    auVar86 = ZEXT1632(auVar57);
    auVar74 = vmulps_avx512vl(auVar74,auVar86);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar74,auVar76,auVar80);
    fVar222 = auVar57._0_4_;
    fVar223 = auVar57._4_4_;
    auVar21._4_4_ = fVar223 * auVar75._4_4_;
    auVar21._0_4_ = fVar222 * auVar75._0_4_;
    fVar224 = auVar57._8_4_;
    auVar21._8_4_ = fVar224 * auVar75._8_4_;
    fVar225 = auVar57._12_4_;
    auVar21._12_4_ = fVar225 * auVar75._12_4_;
    auVar21._16_4_ = auVar75._16_4_ * 0.0;
    auVar21._20_4_ = auVar75._20_4_ * 0.0;
    auVar21._24_4_ = auVar75._24_4_ * 0.0;
    auVar21._28_4_ = fVar212;
    auVar22._4_4_ = fVar223 * auVar77._4_4_;
    auVar22._0_4_ = fVar222 * auVar77._0_4_;
    auVar22._8_4_ = fVar224 * auVar77._8_4_;
    auVar22._12_4_ = fVar225 * auVar77._12_4_;
    auVar22._16_4_ = auVar77._16_4_ * 0.0;
    auVar22._20_4_ = auVar77._20_4_ * 0.0;
    auVar22._24_4_ = auVar77._24_4_ * 0.0;
    auVar22._28_4_ = auVar87._28_4_;
    auVar59 = vfmadd231ps_fma(auVar21,auVar76,ZEXT1632(auVar59));
    auVar61 = vfmadd231ps_fma(auVar22,auVar76,ZEXT1632(auVar61));
    auVar129._0_4_ = fVar222 * auVar78._0_4_;
    auVar129._4_4_ = fVar223 * auVar78._4_4_;
    auVar129._8_4_ = fVar224 * auVar78._8_4_;
    auVar129._12_4_ = fVar225 * auVar78._12_4_;
    auVar129._16_4_ = auVar78._16_4_ * 0.0;
    auVar129._20_4_ = auVar78._20_4_ * 0.0;
    auVar129._24_4_ = auVar78._24_4_ * 0.0;
    auVar129._28_4_ = 0;
    auVar23._4_4_ = fVar223 * auVar79._4_4_;
    auVar23._0_4_ = fVar222 * auVar79._0_4_;
    auVar23._8_4_ = fVar224 * auVar79._8_4_;
    auVar23._12_4_ = fVar225 * auVar79._12_4_;
    auVar23._16_4_ = auVar79._16_4_ * 0.0;
    auVar23._20_4_ = auVar79._20_4_ * 0.0;
    auVar23._24_4_ = auVar79._24_4_ * 0.0;
    auVar23._28_4_ = auVar78._28_4_;
    auVar45 = vfmadd231ps_fma(auVar129,auVar76,auVar75);
    auVar46 = vfmadd231ps_fma(auVar23,auVar76,auVar77);
    auVar24._28_4_ = auVar77._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * auVar46._12_4_,
                            CONCAT48(fVar224 * auVar46._8_4_,
                                     CONCAT44(fVar223 * auVar46._4_4_,fVar222 * auVar46._0_4_))));
    auVar48 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar225 * auVar45._12_4_,
                                                 CONCAT48(fVar224 * auVar45._8_4_,
                                                          CONCAT44(fVar223 * auVar45._4_4_,
                                                                   fVar222 * auVar45._0_4_)))),
                              auVar76,ZEXT1632(auVar59));
    auVar49 = vfmadd231ps_fma(auVar24,auVar76,ZEXT1632(auVar61));
    auVar75 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar59));
    auVar87 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar61));
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar77);
    auVar87 = vmulps_avx512vl(auVar87,auVar77);
    auVar205._0_4_ = fVar111 * auVar75._0_4_;
    auVar205._4_4_ = fVar111 * auVar75._4_4_;
    auVar205._8_4_ = fVar111 * auVar75._8_4_;
    auVar205._12_4_ = fVar111 * auVar75._12_4_;
    auVar205._16_4_ = fVar111 * auVar75._16_4_;
    auVar205._20_4_ = fVar111 * auVar75._20_4_;
    auVar205._24_4_ = fVar111 * auVar75._24_4_;
    auVar205._28_4_ = 0;
    auVar75 = vmulps_avx512vl(auVar210,auVar87);
    auVar61 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_01feed00,ZEXT1632(auVar61));
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar49),_DAT_01feed00,ZEXT1632(auVar61));
    auVar130._0_4_ = auVar205._0_4_ + auVar48._0_4_;
    auVar130._4_4_ = auVar205._4_4_ + auVar48._4_4_;
    auVar130._8_4_ = auVar205._8_4_ + auVar48._8_4_;
    auVar130._12_4_ = auVar205._12_4_ + auVar48._12_4_;
    auVar130._16_4_ = auVar205._16_4_ + 0.0;
    auVar130._20_4_ = auVar205._20_4_ + 0.0;
    auVar130._24_4_ = auVar205._24_4_ + 0.0;
    auVar130._28_4_ = 0;
    auVar90 = ZEXT1632(auVar61);
    auVar79 = vpermt2ps_avx512vl(auVar205,_DAT_01feed00,auVar90);
    auVar80 = vaddps_avx512vl(ZEXT1632(auVar49),auVar75);
    auVar81 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar90);
    auVar75 = vsubps_avx(auVar87,auVar79);
    auVar79 = vsubps_avx512vl(auVar78,auVar81);
    auVar81 = vmulps_avx512vl(auVar72,auVar86);
    auVar74 = vmulps_avx512vl(auVar88,auVar86);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar76,auVar82);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar76,auVar83);
    auVar82 = vmulps_avx512vl(auVar73,auVar86);
    auVar83 = vmulps_avx512vl(auVar89,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar76,auVar72);
    auVar88 = vfmadd231ps_avx512vl(auVar83,auVar76,auVar88);
    auVar83 = vmulps_avx512vl(auVar84,auVar86);
    auVar72 = vmulps_avx512vl(auVar85,auVar86);
    auVar59 = vfmadd231ps_fma(auVar83,auVar76,auVar73);
    auVar83 = vfmadd231ps_avx512vl(auVar72,auVar76,auVar89);
    auVar72 = vmulps_avx512vl(auVar86,auVar82);
    auVar84 = ZEXT1632(auVar57);
    auVar73 = vmulps_avx512vl(auVar84,auVar88);
    auVar81 = vfmadd231ps_avx512vl(auVar72,auVar76,auVar81);
    auVar74 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar74);
    auVar83 = vmulps_avx512vl(auVar84,auVar83);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar225 * auVar59._12_4_,
                                            CONCAT48(fVar224 * auVar59._8_4_,
                                                     CONCAT44(fVar223 * auVar59._4_4_,
                                                              fVar222 * auVar59._0_4_)))),auVar76,
                         auVar82);
    auVar88 = vfmadd231ps_avx512vl(auVar83,auVar76,auVar88);
    auVar25._4_4_ = fVar223 * auVar82._4_4_;
    auVar25._0_4_ = fVar222 * auVar82._0_4_;
    auVar25._8_4_ = fVar224 * auVar82._8_4_;
    auVar25._12_4_ = fVar225 * auVar82._12_4_;
    auVar25._16_4_ = auVar82._16_4_ * 0.0;
    auVar25._20_4_ = auVar82._20_4_ * 0.0;
    auVar25._24_4_ = auVar82._24_4_ * 0.0;
    auVar25._28_4_ = auVar89._28_4_;
    auVar89 = vmulps_avx512vl(auVar84,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar25,auVar76,auVar81);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar74,auVar76);
    auVar76 = vsubps_avx512vl(auVar82,auVar81);
    auVar88 = vsubps_avx512vl(auVar88,auVar74);
    auVar76 = vmulps_avx512vl(auVar76,auVar77);
    auVar88 = vmulps_avx512vl(auVar88,auVar77);
    fVar212 = fVar111 * auVar76._0_4_;
    fVar222 = fVar111 * auVar76._4_4_;
    auVar26._4_4_ = fVar222;
    auVar26._0_4_ = fVar212;
    fVar223 = fVar111 * auVar76._8_4_;
    auVar26._8_4_ = fVar223;
    fVar224 = fVar111 * auVar76._12_4_;
    auVar26._12_4_ = fVar224;
    fVar225 = fVar111 * auVar76._16_4_;
    auVar26._16_4_ = fVar225;
    fVar226 = fVar111 * auVar76._20_4_;
    auVar26._20_4_ = fVar226;
    fVar111 = fVar111 * auVar76._24_4_;
    auVar26._24_4_ = fVar111;
    auVar26._28_4_ = auVar76._28_4_;
    auVar88 = vmulps_avx512vl(auVar210,auVar88);
    auVar77 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar90);
    auVar81 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar90);
    auVar211._0_4_ = auVar83._0_4_ + fVar212;
    auVar211._4_4_ = auVar83._4_4_ + fVar222;
    auVar211._8_4_ = auVar83._8_4_ + fVar223;
    auVar211._12_4_ = auVar83._12_4_ + fVar224;
    auVar211._16_4_ = auVar83._16_4_ + fVar225;
    auVar211._20_4_ = auVar83._20_4_ + fVar226;
    auVar211._24_4_ = auVar83._24_4_ + fVar111;
    auVar211._28_4_ = auVar83._28_4_ + auVar76._28_4_;
    auVar76 = vpermt2ps_avx512vl(auVar26,_DAT_01feed00,ZEXT1632(auVar61));
    auVar74 = vaddps_avx512vl(auVar89,auVar88);
    auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,ZEXT1632(auVar61));
    auVar76 = vsubps_avx(auVar77,auVar76);
    auVar88 = vsubps_avx512vl(auVar81,auVar88);
    auVar144 = ZEXT1632(auVar48);
    auVar82 = vsubps_avx512vl(auVar83,auVar144);
    auVar158 = ZEXT1632(auVar49);
    auVar72 = vsubps_avx512vl(auVar89,auVar158);
    auVar73 = vsubps_avx512vl(auVar77,auVar87);
    auVar82 = vaddps_avx512vl(auVar82,auVar73);
    auVar73 = vsubps_avx512vl(auVar81,auVar78);
    auVar72 = vaddps_avx512vl(auVar72,auVar73);
    auVar73 = vmulps_avx512vl(auVar158,auVar82);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar144,auVar72);
    auVar84 = vmulps_avx512vl(auVar80,auVar82);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar130,auVar72);
    auVar85 = vmulps_avx512vl(auVar79,auVar82);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar75,auVar72);
    auVar86 = vmulps_avx512vl(auVar78,auVar82);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar87,auVar72);
    auVar90 = vmulps_avx512vl(auVar89,auVar82);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar83,auVar72);
    auVar91 = vmulps_avx512vl(auVar74,auVar82);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar211,auVar72);
    auVar92 = vmulps_avx512vl(auVar88,auVar82);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar76,auVar72);
    auVar82 = vmulps_avx512vl(auVar81,auVar82);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar77,auVar72);
    auVar72 = vminps_avx512vl(auVar73,auVar84);
    auVar73 = vmaxps_avx512vl(auVar73,auVar84);
    auVar84 = vminps_avx512vl(auVar85,auVar86);
    auVar72 = vminps_avx512vl(auVar72,auVar84);
    auVar84 = vmaxps_avx512vl(auVar85,auVar86);
    auVar73 = vmaxps_avx512vl(auVar73,auVar84);
    auVar84 = vminps_avx512vl(auVar90,auVar91);
    auVar85 = vmaxps_avx512vl(auVar90,auVar91);
    auVar86 = vminps_avx512vl(auVar92,auVar82);
    auVar84 = vminps_avx512vl(auVar84,auVar86);
    auVar72 = vminps_avx512vl(auVar72,auVar84);
    auVar82 = vmaxps_avx512vl(auVar92,auVar82);
    auVar82 = vmaxps_avx512vl(auVar85,auVar82);
    auVar82 = vmaxps_avx512vl(auVar73,auVar82);
    uVar15 = vcmpps_avx512vl(auVar72,local_480,2);
    auVar27._4_4_ = uStack_3bc;
    auVar27._0_4_ = local_3c0;
    auVar27._8_4_ = uStack_3b8;
    auVar27._12_4_ = uStack_3b4;
    auVar27._16_4_ = uStack_3b0;
    auVar27._20_4_ = uStack_3ac;
    auVar27._24_4_ = uStack_3a8;
    auVar27._28_4_ = uStack_3a4;
    uVar16 = vcmpps_avx512vl(auVar82,auVar27,5);
    bVar28 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar28 == 0) {
      auVar43 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar93._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar93._32_32_ = auVar95._32_32_;
      auVar94._16_48_ = auVar93._16_48_;
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar94._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar76 = auVar93._0_32_;
      auVar57 = auVar94._0_16_;
    }
    else {
      auVar82 = vsubps_avx512vl(auVar87,auVar144);
      auVar72 = vsubps_avx512vl(auVar78,auVar158);
      auVar73 = vsubps_avx512vl(auVar77,auVar83);
      auVar82 = vaddps_avx512vl(auVar82,auVar73);
      auVar73 = vsubps_avx512vl(auVar81,auVar89);
      auVar72 = vaddps_avx512vl(auVar72,auVar73);
      auVar73 = vmulps_avx512vl(auVar158,auVar82);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar144);
      auVar80 = vmulps_avx512vl(auVar80,auVar82);
      auVar80 = vfnmadd213ps_avx512vl(auVar130,auVar72,auVar80);
      auVar79 = vmulps_avx512vl(auVar79,auVar82);
      auVar79 = vfnmadd213ps_avx512vl(auVar75,auVar72,auVar79);
      auVar75 = vmulps_avx512vl(auVar78,auVar82);
      auVar78 = vfnmadd231ps_avx512vl(auVar75,auVar72,auVar87);
      auVar75 = vmulps_avx512vl(auVar89,auVar82);
      auVar89 = vfnmadd231ps_avx512vl(auVar75,auVar72,auVar83);
      auVar75 = vmulps_avx512vl(auVar74,auVar82);
      auVar74 = vfnmadd213ps_avx512vl(auVar211,auVar72,auVar75);
      auVar75 = vmulps_avx512vl(auVar88,auVar82);
      auVar83 = vfnmadd213ps_avx512vl(auVar76,auVar72,auVar75);
      auVar76 = vmulps_avx512vl(auVar81,auVar82);
      auVar77 = vfnmadd231ps_avx512vl(auVar76,auVar77,auVar72);
      auVar75 = vminps_avx(auVar73,auVar80);
      auVar76 = vmaxps_avx(auVar73,auVar80);
      auVar87 = vminps_avx(auVar79,auVar78);
      auVar87 = vminps_avx(auVar75,auVar87);
      auVar75 = vmaxps_avx(auVar79,auVar78);
      auVar76 = vmaxps_avx(auVar76,auVar75);
      auVar88 = vminps_avx(auVar89,auVar74);
      auVar75 = vmaxps_avx(auVar89,auVar74);
      auVar89 = vminps_avx(auVar83,auVar77);
      auVar88 = vminps_avx(auVar88,auVar89);
      auVar88 = vminps_avx(auVar87,auVar88);
      auVar87 = vmaxps_avx(auVar83,auVar77);
      auVar75 = vmaxps_avx(auVar75,auVar87);
      auVar76 = vmaxps_avx(auVar76,auVar75);
      uVar15 = vcmpps_avx512vl(auVar76,auVar27,5);
      uVar16 = vcmpps_avx512vl(auVar88,local_480,2);
      bVar28 = bVar28 & (byte)uVar15 & (byte)uVar16;
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      if (bVar28 != 0) {
        auStack_630[uVar30] = (uint)bVar28;
        uVar15 = vmovlps_avx(auVar43);
        (&uStack_460)[uVar30] = uVar15;
        uVar3 = vmovlps_avx(auVar60);
        auStack_3a0[uVar30] = uVar3;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
      auVar43 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar94._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar94._32_32_ = auVar95._32_32_;
      auVar76 = auVar94._0_32_;
    }
    auVar262 = ZEXT1664(auVar57);
    in_ZMM23 = ZEXT1664(auVar59);
    auVar261 = ZEXT3264(auVar76);
    auVar260 = ZEXT1664(auVar60);
    auVar259 = ZEXT1664(auVar61);
    auVar117 = ZEXT1664(auVar43);
LAB_01e2a3e4:
    do {
      do {
        auVar57 = auVar117._0_16_;
        auVar59 = auVar262._0_16_;
        if ((int)uVar30 == 0) {
          if (bVar37 != false) {
            return bVar37;
          }
          uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar20._4_4_ = uVar112;
          auVar20._0_4_ = uVar112;
          auVar20._8_4_ = uVar112;
          auVar20._12_4_ = uVar112;
          auVar20._16_4_ = uVar112;
          auVar20._20_4_ = uVar112;
          auVar20._24_4_ = uVar112;
          auVar20._28_4_ = uVar112;
          uVar15 = vcmpps_avx512vl(local_3e0,auVar20,2);
          uVar38 = (uint)uVar33 & (uint)uVar33 + 0xff & (uint)uVar15;
          uVar33 = (ulong)uVar38;
          if (uVar38 == 0) {
            return false;
          }
          goto LAB_01e29329;
        }
        uVar29 = (int)uVar30 - 1;
        uVar31 = (ulong)uVar29;
        uVar8 = auStack_630[uVar31];
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auStack_3a0[uVar31];
        uVar3 = 0;
        for (uVar36 = (ulong)uVar8; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          uVar3 = uVar3 + 1;
        }
        uVar34 = uVar8 - 1 & uVar8;
        bVar41 = uVar34 == 0;
        auStack_630[uVar31] = uVar34;
        if (bVar41) {
          uVar30 = (ulong)uVar29;
        }
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar3;
        auVar43 = vpunpcklqdq_avx(auVar113,ZEXT416((int)uVar3 + 1));
        auVar95._32_32_ = auVar94._32_32_;
        auVar43 = vcvtqq2ps_avx512vl(auVar43);
        auVar43 = vmulps_avx512vl(auVar43,in_ZMM23._0_16_);
        uVar112 = *(undefined4 *)((long)&uStack_460 + uVar31 * 8 + 4);
        auVar17._4_4_ = uVar112;
        auVar17._0_4_ = uVar112;
        auVar17._8_4_ = uVar112;
        auVar17._12_4_ = uVar112;
        auVar61 = vmulps_avx512vl(auVar43,auVar17);
        auVar43 = vsubps_avx512vl(auVar59,auVar43);
        uVar112 = *(undefined4 *)(&uStack_460 + uVar31);
        auVar18._4_4_ = uVar112;
        auVar18._0_4_ = uVar112;
        auVar18._8_4_ = uVar112;
        auVar18._12_4_ = uVar112;
        auVar43 = vfmadd231ps_avx512vl(auVar61,auVar43,auVar18);
        auVar61 = vmovshdup_avx(auVar43);
        fVar111 = auVar61._0_4_ - auVar43._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar111));
        if (uVar8 == 0 || bVar41) goto LAB_01e2b33b;
        auVar61 = vshufps_avx(auVar60,auVar60,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar111));
        auVar48 = vsubps_avx512vl(auVar59,auVar61);
        fVar212 = auVar61._0_4_;
        auVar153._0_4_ = fVar212 * fVar118;
        fVar222 = auVar61._4_4_;
        auVar153._4_4_ = fVar222 * fVar119;
        fVar223 = auVar61._8_4_;
        auVar153._8_4_ = fVar223 * fVar118;
        fVar224 = auVar61._12_4_;
        auVar153._12_4_ = fVar224 * fVar119;
        auVar167._0_4_ = fVar212 * fVar120;
        auVar167._4_4_ = fVar222 * fVar121;
        auVar167._8_4_ = fVar223 * fVar120;
        auVar167._12_4_ = fVar224 * fVar121;
        auVar173._0_4_ = fVar212 * fVar131;
        auVar173._4_4_ = fVar222 * fVar140;
        auVar173._8_4_ = fVar223 * fVar131;
        auVar173._12_4_ = fVar224 * fVar140;
        auVar134._0_4_ = fVar212 * fVar227;
        auVar134._4_4_ = fVar222 * fVar236;
        auVar134._8_4_ = fVar223 * fVar227;
        auVar134._12_4_ = fVar224 * fVar236;
        auVar61 = vfmadd231ps_fma(auVar153,auVar48,auVar44);
        auVar45 = vfmadd231ps_fma(auVar167,auVar48,auVar55);
        auVar46 = vfmadd231ps_fma(auVar173,auVar48,auVar47);
        auVar48 = vfmadd231ps_fma(auVar134,auVar48,auVar196);
        auVar145._16_16_ = auVar61;
        auVar145._0_16_ = auVar61;
        auVar159._16_16_ = auVar45;
        auVar159._0_16_ = auVar45;
        auVar171._16_16_ = auVar46;
        auVar171._0_16_ = auVar46;
        auVar75 = vpermps_avx2(_DAT_01feed20,ZEXT1632(auVar43));
        auVar76 = vsubps_avx(auVar159,auVar145);
        auVar45 = vfmadd213ps_fma(auVar76,auVar75,auVar145);
        auVar76 = vsubps_avx(auVar171,auVar159);
        auVar49 = vfmadd213ps_fma(auVar76,auVar75,auVar159);
        auVar61 = vsubps_avx(auVar48,auVar46);
        auVar160._16_16_ = auVar61;
        auVar160._0_16_ = auVar61;
        auVar61 = vfmadd213ps_fma(auVar160,auVar75,auVar171);
        auVar76 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar45));
        auVar45 = vfmadd213ps_fma(auVar76,auVar75,ZEXT1632(auVar45));
        auVar76 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar49));
        auVar61 = vfmadd213ps_fma(auVar76,auVar75,ZEXT1632(auVar49));
        auVar76 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar45));
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar76,auVar75);
        auVar95._0_32_ = vmulps_avx512vl(auVar76,auVar261._0_32_);
        fVar212 = fVar111 * 0.33333334;
        auVar174._0_8_ =
             CONCAT44(auVar133._4_4_ + fVar212 * auVar95._4_4_,
                      auVar133._0_4_ + fVar212 * auVar95._0_4_);
        auVar174._8_4_ = auVar133._8_4_ + fVar212 * auVar95._8_4_;
        auVar174._12_4_ = auVar133._12_4_ + fVar212 * auVar95._12_4_;
        auVar154._0_4_ = fVar212 * auVar95._16_4_;
        auVar154._4_4_ = fVar212 * auVar95._20_4_;
        auVar154._8_4_ = fVar212 * auVar95._24_4_;
        auVar154._12_4_ = fVar212 * auVar95._28_4_;
        auVar69 = vsubps_avx((undefined1  [16])0x0,auVar154);
        auVar49 = vshufpd_avx(auVar133,auVar133,3);
        auVar50 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar61 = vsubps_avx(auVar49,auVar133);
        auVar45 = vsubps_avx(auVar50,(undefined1  [16])0x0);
        auVar197._0_4_ = auVar61._0_4_ + auVar45._0_4_;
        auVar197._4_4_ = auVar61._4_4_ + auVar45._4_4_;
        auVar197._8_4_ = auVar61._8_4_ + auVar45._8_4_;
        auVar197._12_4_ = auVar61._12_4_ + auVar45._12_4_;
        auVar61 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar45 = vshufps_avx(auVar174,auVar174,0xb1);
        auVar46 = vshufps_avx(auVar69,auVar69,0xb1);
        auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar246._4_4_ = auVar197._0_4_;
        auVar246._0_4_ = auVar197._0_4_;
        auVar246._8_4_ = auVar197._0_4_;
        auVar246._12_4_ = auVar197._0_4_;
        auVar53 = vshufps_avx(auVar197,auVar197,0x55);
        fVar212 = auVar53._0_4_;
        auVar207._0_4_ = auVar61._0_4_ * fVar212;
        fVar222 = auVar53._4_4_;
        auVar207._4_4_ = auVar61._4_4_ * fVar222;
        fVar223 = auVar53._8_4_;
        auVar207._8_4_ = auVar61._8_4_ * fVar223;
        fVar224 = auVar53._12_4_;
        auVar207._12_4_ = auVar61._12_4_ * fVar224;
        auVar214._0_4_ = auVar45._0_4_ * fVar212;
        auVar214._4_4_ = auVar45._4_4_ * fVar222;
        auVar214._8_4_ = auVar45._8_4_ * fVar223;
        auVar214._12_4_ = auVar45._12_4_ * fVar224;
        auVar230._0_4_ = auVar46._0_4_ * fVar212;
        auVar230._4_4_ = auVar46._4_4_ * fVar222;
        auVar230._8_4_ = auVar46._8_4_ * fVar223;
        auVar230._12_4_ = auVar46._12_4_ * fVar224;
        auVar198._0_4_ = auVar48._0_4_ * fVar212;
        auVar198._4_4_ = auVar48._4_4_ * fVar222;
        auVar198._8_4_ = auVar48._8_4_ * fVar223;
        auVar198._12_4_ = auVar48._12_4_ * fVar224;
        auVar61 = vfmadd231ps_fma(auVar207,auVar246,auVar133);
        auVar45 = vfmadd231ps_fma(auVar214,auVar246,auVar174);
        auVar67 = vfmadd231ps_fma(auVar230,auVar246,auVar69);
        auVar68 = vfmadd231ps_fma(auVar198,(undefined1  [16])0x0,auVar246);
        auVar53 = vshufpd_avx(auVar61,auVar61,1);
        auVar54 = vshufpd_avx(auVar45,auVar45,1);
        auVar94._16_48_ = auVar95._16_48_;
        auVar65 = vshufpd_avx512vl(auVar67,auVar67,1);
        auVar66 = vshufpd_avx512vl(auVar68,auVar68,1);
        auVar46 = vminss_avx(auVar61,auVar45);
        auVar61 = vmaxss_avx(auVar45,auVar61);
        auVar48 = vminss_avx(auVar67,auVar68);
        auVar45 = vmaxss_avx(auVar68,auVar67);
        auVar46 = vminss_avx(auVar46,auVar48);
        auVar61 = vmaxss_avx(auVar45,auVar61);
        auVar48 = vminss_avx(auVar53,auVar54);
        auVar45 = vmaxss_avx(auVar54,auVar53);
        auVar53 = vminss_avx512f(auVar65,auVar66);
        auVar54 = vmaxss_avx512f(auVar66,auVar65);
        auVar45 = vmaxss_avx(auVar54,auVar45);
        auVar94._0_16_ = vminss_avx512f(auVar48,auVar53);
        fVar222 = auVar45._0_4_;
        fVar212 = auVar61._0_4_;
        if (auVar46._0_4_ < 0.0001) {
          bVar42 = fVar222 == -0.0001;
          bVar39 = NAN(fVar222);
          if (fVar222 <= -0.0001) goto LAB_01e2a61d;
          break;
        }
LAB_01e2a61d:
        vucomiss_avx512f(auVar94._0_16_);
        bVar42 = fVar222 <= -0.0001;
        bVar40 = -0.0001 < fVar212;
        bVar39 = bVar42;
        if (!bVar42) break;
        uVar15 = vcmpps_avx512vl(auVar46,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar16 = vcmpps_avx512vl(auVar94._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar28 = (byte)uVar15 & (byte)uVar16 & 1;
        bVar42 = bVar40 && bVar28 == 0;
        bVar39 = bVar40 && bVar28 == 0;
      } while (!bVar40 || bVar28 != 0);
      vcmpss_avx512f(auVar46,auVar57,1);
      auVar54 = auVar263._0_16_;
      uVar15 = vcmpss_avx512f(auVar61,auVar57,1);
      bVar40 = (bool)((byte)uVar15 & 1);
      auVar97._16_48_ = auVar94._16_48_;
      auVar97._0_16_ = auVar54;
      iVar110 = auVar263._0_4_;
      auVar96._4_60_ = auVar97._4_60_;
      auVar96._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar110);
      vucomiss_avx512f(auVar96._0_16_);
      bVar39 = (bool)(!bVar42 | bVar39);
      bVar40 = bVar39 == false;
      auVar99._16_48_ = auVar94._16_48_;
      auVar99._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar98._4_60_ = auVar99._4_60_;
      auVar98._0_4_ = (uint)bVar39 * auVar117._0_4_ + (uint)!bVar39 * 0x7f800000;
      auVar53 = auVar98._0_16_;
      auVar101._16_48_ = auVar94._16_48_;
      auVar101._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar100._4_60_ = auVar101._4_60_;
      auVar100._0_4_ = (uint)bVar39 * auVar117._0_4_ + (uint)!bVar39 * -0x800000;
      auVar48 = auVar100._0_16_;
      uVar15 = vcmpss_avx512f(auVar94._0_16_,auVar57,1);
      bVar42 = (bool)((byte)uVar15 & 1);
      auVar103._16_48_ = auVar94._16_48_;
      auVar103._0_16_ = auVar54;
      auVar102._4_60_ = auVar103._4_60_;
      auVar102._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * iVar110);
      vucomiss_avx512f(auVar102._0_16_);
      if ((bVar39) || (bVar40)) {
        auVar67 = vucomiss_avx512f(auVar46);
        if ((bVar39) || (bVar40)) {
          auVar68 = vxorps_avx512vl(auVar46,auVar260._0_16_);
          auVar46 = vsubss_avx512f(auVar67,auVar46);
          auVar46 = vdivss_avx512f(auVar68,auVar46);
          auVar67 = vsubss_avx512f(auVar54,auVar46);
          auVar46 = vfmadd213ss_avx512f(auVar67,auVar57,auVar46);
          auVar67 = auVar46;
        }
        else {
          auVar67 = vxorps_avx512vl(auVar67,auVar67);
          vucomiss_avx512f(auVar67);
          if ((bVar39) || (auVar46 = auVar54, bVar40)) {
            auVar46 = SUB6416(ZEXT464(0xff800000),0);
            auVar67 = ZEXT416(0x7f800000);
          }
        }
        auVar53 = vminss_avx512f(auVar53,auVar67);
        auVar48 = vmaxss_avx(auVar46,auVar48);
      }
      uVar15 = vcmpss_avx512f(auVar45,auVar57,1);
      bVar42 = (bool)((byte)uVar15 & 1);
      fVar223 = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * iVar110);
      if ((auVar96._0_4_ != fVar223) || (NAN(auVar96._0_4_) || NAN(fVar223))) {
        if ((fVar222 != fVar212) || (NAN(fVar222) || NAN(fVar212))) {
          auVar61 = vxorps_avx512vl(auVar61,auVar260._0_16_);
          auVar199._0_4_ = auVar61._0_4_ / (fVar222 - fVar212);
          auVar199._4_12_ = auVar61._4_12_;
          auVar61 = vsubss_avx512f(auVar54,auVar199);
          auVar61 = vfmadd213ss_avx512f(auVar61,auVar57,auVar199);
          auVar45 = auVar61;
        }
        else if ((fVar212 != 0.0) ||
                (auVar61 = auVar54, auVar45 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar212))) {
          auVar61 = SUB6416(ZEXT464(0xff800000),0);
          auVar45 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar53 = vminss_avx(auVar53,auVar45);
        auVar48 = vmaxss_avx(auVar61,auVar48);
      }
      bVar42 = auVar102._0_4_ != fVar223;
      auVar61 = vminss_avx512f(auVar53,auVar54);
      auVar105._16_48_ = auVar94._16_48_;
      auVar105._0_16_ = auVar53;
      auVar104._4_60_ = auVar105._4_60_;
      auVar104._0_4_ = (uint)bVar42 * auVar61._0_4_ + (uint)!bVar42 * auVar53._0_4_;
      auVar61 = vmaxss_avx512f(auVar54,auVar48);
      auVar107._16_48_ = auVar94._16_48_;
      auVar107._0_16_ = auVar48;
      auVar106._4_60_ = auVar107._4_60_;
      auVar106._0_4_ = (uint)bVar42 * auVar61._0_4_ + (uint)!bVar42 * auVar48._0_4_;
      auVar61 = vmaxss_avx512f(auVar57,auVar104._0_16_);
      auVar94._0_16_ = vminss_avx512f(auVar106._0_16_,auVar54);
    } while (auVar94._0_4_ < auVar61._0_4_);
    auVar45 = vaddss_avx512f(auVar94._0_16_,SUB6416(ZEXT464(0x3dcccccd),0));
    auVar67 = vmaxss_avx512f(auVar57,ZEXT416((uint)(auVar61._0_4_ + -0.1)));
    auVar68 = vminss_avx512f(auVar45,auVar54);
    auVar135._0_8_ = auVar133._0_8_;
    auVar135._8_8_ = auVar135._0_8_;
    auVar215._8_8_ = auVar174._0_8_;
    auVar215._0_8_ = auVar174._0_8_;
    auVar231._8_8_ = auVar69._0_8_;
    auVar231._0_8_ = auVar69._0_8_;
    auVar61 = vshufpd_avx(auVar174,auVar174,3);
    auVar45 = vshufpd_avx(auVar69,auVar69,3);
    auVar46 = vshufps_avx(auVar67,auVar68,0);
    auVar53 = vsubps_avx512vl(auVar59,auVar46);
    fVar212 = auVar46._0_4_;
    auVar168._0_4_ = fVar212 * auVar49._0_4_;
    fVar222 = auVar46._4_4_;
    auVar168._4_4_ = fVar222 * auVar49._4_4_;
    fVar223 = auVar46._8_4_;
    auVar168._8_4_ = fVar223 * auVar49._8_4_;
    fVar224 = auVar46._12_4_;
    auVar168._12_4_ = fVar224 * auVar49._12_4_;
    auVar175._0_4_ = fVar212 * auVar61._0_4_;
    auVar175._4_4_ = fVar222 * auVar61._4_4_;
    auVar175._8_4_ = fVar223 * auVar61._8_4_;
    auVar175._12_4_ = fVar224 * auVar61._12_4_;
    auVar253._0_4_ = auVar45._0_4_ * fVar212;
    auVar253._4_4_ = auVar45._4_4_ * fVar222;
    auVar253._8_4_ = auVar45._8_4_ * fVar223;
    auVar253._12_4_ = auVar45._12_4_ * fVar224;
    auVar155._0_4_ = fVar212 * auVar50._0_4_;
    auVar155._4_4_ = fVar222 * auVar50._4_4_;
    auVar155._8_4_ = fVar223 * auVar50._8_4_;
    auVar155._12_4_ = fVar224 * auVar50._12_4_;
    auVar48 = vfmadd231ps_fma(auVar168,auVar53,auVar135);
    auVar49 = vfmadd231ps_fma(auVar175,auVar53,auVar215);
    auVar50 = vfmadd231ps_fma(auVar253,auVar53,auVar231);
    auVar53 = vfmadd231ps_fma(auVar155,auVar53,ZEXT816(0));
    auVar45 = vsubss_avx512f(auVar54,auVar67);
    auVar61 = vmovshdup_avx(auVar60);
    auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar67._0_4_)),auVar60,auVar45);
    auVar45 = vsubss_avx512f(auVar54,auVar68);
    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar68._0_4_)),auVar60,auVar45);
    auVar69 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar111));
    auVar60 = vsubps_avx(auVar49,auVar48);
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar45 = vmulps_avx512vl(auVar60,auVar67);
    auVar60 = vsubps_avx(auVar50,auVar49);
    auVar46 = vmulps_avx512vl(auVar60,auVar67);
    auVar60 = vsubps_avx(auVar53,auVar50);
    auVar60 = vmulps_avx512vl(auVar60,auVar67);
    auVar61 = vminps_avx(auVar46,auVar60);
    auVar60 = vmaxps_avx(auVar46,auVar60);
    auVar61 = vminps_avx(auVar45,auVar61);
    auVar60 = vmaxps_avx(auVar45,auVar60);
    auVar45 = vshufpd_avx(auVar61,auVar61,3);
    auVar46 = vshufpd_avx(auVar60,auVar60,3);
    auVar61 = vminps_avx(auVar61,auVar45);
    auVar60 = vmaxps_avx(auVar60,auVar46);
    fVar111 = auVar69._0_4_;
    auVar200._0_4_ = auVar61._0_4_ * fVar111;
    auVar200._4_4_ = auVar61._4_4_ * fVar111;
    auVar200._8_4_ = auVar61._8_4_ * fVar111;
    auVar200._12_4_ = auVar61._12_4_ * fVar111;
    auVar186._0_4_ = fVar111 * auVar60._0_4_;
    auVar186._4_4_ = fVar111 * auVar60._4_4_;
    auVar186._8_4_ = fVar111 * auVar60._8_4_;
    auVar186._12_4_ = fVar111 * auVar60._12_4_;
    auVar69 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar65._0_4_ - auVar133._0_4_)));
    auVar60 = vshufpd_avx(auVar48,auVar48,3);
    auVar61 = vshufpd_avx(auVar49,auVar49,3);
    auVar45 = vshufpd_avx(auVar50,auVar50,3);
    auVar46 = vshufpd_avx(auVar53,auVar53,3);
    auVar60 = vsubps_avx(auVar60,auVar48);
    auVar48 = vsubps_avx(auVar61,auVar49);
    auVar49 = vsubps_avx(auVar45,auVar50);
    auVar46 = vsubps_avx(auVar46,auVar53);
    auVar61 = vminps_avx(auVar60,auVar48);
    auVar60 = vmaxps_avx(auVar60,auVar48);
    auVar45 = vminps_avx(auVar49,auVar46);
    auVar45 = vminps_avx(auVar61,auVar45);
    auVar61 = vmaxps_avx(auVar49,auVar46);
    auVar60 = vmaxps_avx(auVar60,auVar61);
    fVar111 = auVar69._0_4_;
    auVar232._0_4_ = fVar111 * auVar45._0_4_;
    auVar232._4_4_ = fVar111 * auVar45._4_4_;
    auVar232._8_4_ = fVar111 * auVar45._8_4_;
    auVar232._12_4_ = fVar111 * auVar45._12_4_;
    auVar216._0_4_ = fVar111 * auVar60._0_4_;
    auVar216._4_4_ = fVar111 * auVar60._4_4_;
    auVar216._8_4_ = fVar111 * auVar60._8_4_;
    auVar216._12_4_ = fVar111 * auVar60._12_4_;
    auVar46 = vinsertps_avx(auVar43,auVar133,0x10);
    auVar66 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar65);
    auVar123._0_4_ = auVar46._0_4_ + auVar66._0_4_;
    auVar123._4_4_ = auVar46._4_4_ + auVar66._4_4_;
    auVar123._8_4_ = auVar46._8_4_ + auVar66._8_4_;
    auVar123._12_4_ = auVar46._12_4_ + auVar66._12_4_;
    auVar69 = vmulps_avx512vl(auVar123,auVar259._0_16_);
    auVar61 = vshufps_avx(auVar69,auVar69,0x54);
    uVar112 = auVar69._0_4_;
    auVar125._4_4_ = uVar112;
    auVar125._0_4_ = uVar112;
    auVar125._8_4_ = uVar112;
    auVar125._12_4_ = uVar112;
    auVar49 = vfmadd213ps_avx512vl(local_490,auVar125,auVar56);
    auVar45 = vfmadd213ps_fma(local_4a0,auVar125,auVar52);
    auVar48 = vfmadd213ps_fma(local_4b0,auVar125,auVar51);
    auVar60 = vsubps_avx(auVar45,auVar49);
    auVar49 = vfmadd213ps_fma(auVar60,auVar125,auVar49);
    auVar60 = vsubps_avx(auVar48,auVar45);
    auVar60 = vfmadd213ps_fma(auVar60,auVar125,auVar45);
    auVar60 = vsubps_avx(auVar60,auVar49);
    auVar45 = vfmadd231ps_fma(auVar49,auVar60,auVar125);
    auVar50 = vmulps_avx512vl(auVar60,auVar67);
    auVar240._8_8_ = auVar45._0_8_;
    auVar240._0_8_ = auVar45._0_8_;
    auVar60 = vshufpd_avx(auVar45,auVar45,3);
    auVar45 = vshufps_avx(auVar69,auVar69,0x55);
    auVar48 = vsubps_avx(auVar60,auVar240);
    auVar49 = vfmadd231ps_fma(auVar240,auVar45,auVar48);
    auVar254._8_8_ = auVar50._0_8_;
    auVar254._0_8_ = auVar50._0_8_;
    auVar60 = vshufpd_avx(auVar50,auVar50,3);
    auVar60 = vsubps_avx512vl(auVar60,auVar254);
    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar45,auVar254);
    auVar126._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
    auVar126._8_4_ = auVar48._8_4_ ^ 0x80000000;
    auVar126._12_4_ = auVar48._12_4_ ^ 0x80000000;
    auVar45 = vmovshdup_avx512vl(auVar60);
    auVar255._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
    auVar255._8_4_ = auVar45._8_4_ ^ 0x80000000;
    auVar255._12_4_ = auVar45._12_4_ ^ 0x80000000;
    auVar50 = vmovshdup_avx512vl(auVar48);
    auVar53 = vpermt2ps_avx512vl(auVar255,ZEXT416(5),auVar48);
    auVar45 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar48._0_4_)),auVar60,auVar50);
    auVar48 = vpermt2ps_avx512vl(auVar60,SUB6416(ZEXT464(4),0),auVar126);
    auVar156._0_4_ = auVar45._0_4_;
    auVar156._4_4_ = auVar156._0_4_;
    auVar156._8_4_ = auVar156._0_4_;
    auVar156._12_4_ = auVar156._0_4_;
    auVar60 = vdivps_avx(auVar53,auVar156);
    auVar70 = vdivps_avx512vl(auVar48,auVar156);
    fVar111 = auVar49._0_4_;
    auVar45 = vshufps_avx(auVar49,auVar49,0x55);
    auVar241._0_4_ = fVar111 * auVar60._0_4_ + auVar45._0_4_ * auVar70._0_4_;
    auVar241._4_4_ = fVar111 * auVar60._4_4_ + auVar45._4_4_ * auVar70._4_4_;
    auVar241._8_4_ = fVar111 * auVar60._8_4_ + auVar45._8_4_ * auVar70._8_4_;
    auVar241._12_4_ = fVar111 * auVar60._12_4_ + auVar45._12_4_ * auVar70._12_4_;
    auVar67 = vsubps_avx(auVar61,auVar241);
    auVar45 = vmovshdup_avx(auVar60);
    auVar61 = vinsertps_avx(auVar200,auVar232,0x1c);
    auVar256._0_4_ = auVar45._0_4_ * auVar61._0_4_;
    auVar256._4_4_ = auVar45._4_4_ * auVar61._4_4_;
    auVar256._8_4_ = auVar45._8_4_ * auVar61._8_4_;
    auVar256._12_4_ = auVar45._12_4_ * auVar61._12_4_;
    auVar68 = vinsertps_avx512f(auVar186,auVar216,0x1c);
    auVar45 = vmulps_avx512vl(auVar45,auVar68);
    auVar53 = vminps_avx512vl(auVar256,auVar45);
    auVar49 = vmaxps_avx(auVar45,auVar256);
    auVar50 = vmovshdup_avx(auVar70);
    auVar45 = vinsertps_avx(auVar232,auVar200,0x4c);
    auVar233._0_4_ = auVar50._0_4_ * auVar45._0_4_;
    auVar233._4_4_ = auVar50._4_4_ * auVar45._4_4_;
    auVar233._8_4_ = auVar50._8_4_ * auVar45._8_4_;
    auVar233._12_4_ = auVar50._12_4_ * auVar45._12_4_;
    auVar48 = vinsertps_avx(auVar216,auVar186,0x4c);
    auVar217._0_4_ = auVar50._0_4_ * auVar48._0_4_;
    auVar217._4_4_ = auVar50._4_4_ * auVar48._4_4_;
    auVar217._8_4_ = auVar50._8_4_ * auVar48._8_4_;
    auVar217._12_4_ = auVar50._12_4_ * auVar48._12_4_;
    auVar50 = vminps_avx(auVar233,auVar217);
    auVar53 = vaddps_avx512vl(auVar53,auVar50);
    auVar50 = vmaxps_avx(auVar217,auVar233);
    auVar218._0_4_ = auVar49._0_4_ + auVar50._0_4_;
    auVar218._4_4_ = auVar49._4_4_ + auVar50._4_4_;
    auVar218._8_4_ = auVar49._8_4_ + auVar50._8_4_;
    auVar218._12_4_ = auVar49._12_4_ + auVar50._12_4_;
    auVar234._8_8_ = 0x3f80000000000000;
    auVar234._0_8_ = 0x3f80000000000000;
    auVar49 = vsubps_avx(auVar234,auVar218);
    auVar50 = vsubps_avx(auVar234,auVar53);
    auVar53 = vsubps_avx(auVar46,auVar69);
    auVar69 = vsubps_avx(auVar66,auVar69);
    fVar224 = auVar53._0_4_;
    auVar257._0_4_ = fVar224 * auVar49._0_4_;
    fVar225 = auVar53._4_4_;
    auVar257._4_4_ = fVar225 * auVar49._4_4_;
    fVar226 = auVar53._8_4_;
    auVar257._8_4_ = fVar226 * auVar49._8_4_;
    fVar180 = auVar53._12_4_;
    auVar257._12_4_ = fVar180 * auVar49._12_4_;
    auVar71 = vbroadcastss_avx512vl(auVar60);
    auVar61 = vmulps_avx512vl(auVar71,auVar61);
    auVar68 = vmulps_avx512vl(auVar71,auVar68);
    auVar71 = vminps_avx512vl(auVar61,auVar68);
    auVar68 = vmaxps_avx512vl(auVar68,auVar61);
    auVar61 = vbroadcastss_avx512vl(auVar70);
    auVar45 = vmulps_avx512vl(auVar61,auVar45);
    auVar61 = vmulps_avx512vl(auVar61,auVar48);
    auVar48 = vminps_avx512vl(auVar45,auVar61);
    auVar48 = vaddps_avx512vl(auVar71,auVar48);
    auVar53 = vmulps_avx512vl(auVar53,auVar50);
    fVar111 = auVar69._0_4_;
    auVar219._0_4_ = fVar111 * auVar49._0_4_;
    fVar212 = auVar69._4_4_;
    auVar219._4_4_ = fVar212 * auVar49._4_4_;
    fVar222 = auVar69._8_4_;
    auVar219._8_4_ = fVar222 * auVar49._8_4_;
    fVar223 = auVar69._12_4_;
    auVar219._12_4_ = fVar223 * auVar49._12_4_;
    auVar235._0_4_ = fVar111 * auVar50._0_4_;
    auVar235._4_4_ = fVar212 * auVar50._4_4_;
    auVar235._8_4_ = fVar222 * auVar50._8_4_;
    auVar235._12_4_ = fVar223 * auVar50._12_4_;
    auVar61 = vmaxps_avx(auVar61,auVar45);
    auVar187._0_4_ = auVar68._0_4_ + auVar61._0_4_;
    auVar187._4_4_ = auVar68._4_4_ + auVar61._4_4_;
    auVar187._8_4_ = auVar68._8_4_ + auVar61._8_4_;
    auVar187._12_4_ = auVar68._12_4_ + auVar61._12_4_;
    auVar201._8_8_ = 0x3f800000;
    auVar201._0_8_ = 0x3f800000;
    auVar61 = vsubps_avx(auVar201,auVar187);
    auVar45 = vsubps_avx512vl(auVar201,auVar48);
    auVar247._0_4_ = fVar224 * auVar61._0_4_;
    auVar247._4_4_ = fVar225 * auVar61._4_4_;
    auVar247._8_4_ = fVar226 * auVar61._8_4_;
    auVar247._12_4_ = fVar180 * auVar61._12_4_;
    auVar242._0_4_ = fVar224 * auVar45._0_4_;
    auVar242._4_4_ = fVar225 * auVar45._4_4_;
    auVar242._8_4_ = fVar226 * auVar45._8_4_;
    auVar242._12_4_ = fVar180 * auVar45._12_4_;
    auVar188._0_4_ = fVar111 * auVar61._0_4_;
    auVar188._4_4_ = fVar212 * auVar61._4_4_;
    auVar188._8_4_ = fVar222 * auVar61._8_4_;
    auVar188._12_4_ = fVar223 * auVar61._12_4_;
    auVar202._0_4_ = fVar111 * auVar45._0_4_;
    auVar202._4_4_ = fVar212 * auVar45._4_4_;
    auVar202._8_4_ = fVar222 * auVar45._8_4_;
    auVar202._12_4_ = fVar223 * auVar45._12_4_;
    auVar61 = vminps_avx(auVar247,auVar242);
    auVar45 = vminps_avx512vl(auVar188,auVar202);
    auVar48 = vminps_avx512vl(auVar61,auVar45);
    auVar61 = vmaxps_avx(auVar242,auVar247);
    auVar45 = vmaxps_avx(auVar202,auVar188);
    auVar45 = vmaxps_avx(auVar45,auVar61);
    auVar49 = vminps_avx512vl(auVar257,auVar53);
    auVar61 = vminps_avx(auVar219,auVar235);
    auVar61 = vminps_avx(auVar49,auVar61);
    auVar61 = vhaddps_avx(auVar48,auVar61);
    auVar49 = vmaxps_avx512vl(auVar53,auVar257);
    auVar48 = vmaxps_avx(auVar235,auVar219);
    auVar48 = vmaxps_avx(auVar48,auVar49);
    auVar45 = vhaddps_avx(auVar45,auVar48);
    auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar189._0_4_ = auVar61._0_4_ + auVar67._0_4_;
    auVar189._4_4_ = auVar61._4_4_ + auVar67._4_4_;
    auVar189._8_4_ = auVar61._8_4_ + auVar67._8_4_;
    auVar189._12_4_ = auVar61._12_4_ + auVar67._12_4_;
    auVar203._0_4_ = auVar45._0_4_ + auVar67._0_4_;
    auVar203._4_4_ = auVar45._4_4_ + auVar67._4_4_;
    auVar203._8_4_ = auVar45._8_4_ + auVar67._8_4_;
    auVar203._12_4_ = auVar45._12_4_ + auVar67._12_4_;
    auVar61 = vmaxps_avx(auVar46,auVar189);
    auVar45 = vminps_avx(auVar203,auVar66);
    uVar3 = vcmpps_avx512vl(auVar45,auVar61,1);
    if ((uVar3 & 3) != 0) {
      auVar94._0_16_ = auVar56;
      goto LAB_01e2a3e4;
    }
    uVar3 = vcmpps_avx512vl(auVar203,auVar66,1);
    uVar15 = vcmpps_avx512vl(auVar43,auVar189,1);
    if (((ushort)uVar15 & (ushort)uVar3 & 1) == 0) {
      bVar28 = 0;
    }
    else {
      auVar61 = vmovshdup_avx(auVar189);
      bVar28 = auVar133._0_4_ < auVar61._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    auVar94._0_16_ = auVar56;
    local_640 = auVar58._0_4_;
    fStack_63c = auVar58._4_4_;
    fStack_638 = auVar58._8_4_;
    fStack_634 = auVar58._12_4_;
    if (((3 < (uint)uVar30 || uVar8 != 0 && !bVar41) | bVar28) == 1) {
      lVar32 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar54,auVar67);
        fVar222 = auVar43._0_4_;
        fVar111 = fVar222 * fVar222 * fVar222;
        fVar223 = auVar67._0_4_;
        fVar212 = fVar223 * 3.0 * fVar222 * fVar222;
        fVar222 = fVar222 * fVar223 * fVar223 * 3.0;
        auVar142._4_4_ = fVar111;
        auVar142._0_4_ = fVar111;
        auVar142._8_4_ = fVar111;
        auVar142._12_4_ = fVar111;
        auVar136._4_4_ = fVar212;
        auVar136._0_4_ = fVar212;
        auVar136._8_4_ = fVar212;
        auVar136._12_4_ = fVar212;
        auVar114._4_4_ = fVar222;
        auVar114._0_4_ = fVar222;
        auVar114._8_4_ = fVar222;
        auVar114._12_4_ = fVar222;
        fVar223 = fVar223 * fVar223 * fVar223;
        auVar169._0_4_ = local_640 * fVar223;
        auVar169._4_4_ = fStack_63c * fVar223;
        auVar169._8_4_ = fStack_638 * fVar223;
        auVar169._12_4_ = fStack_634 * fVar223;
        auVar43 = vfmadd231ps_fma(auVar169,auVar51,auVar114);
        auVar43 = vfmadd231ps_fma(auVar43,auVar52,auVar136);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar56,auVar142);
        auVar115._8_8_ = auVar43._0_8_;
        auVar115._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar61 = vshufps_avx(auVar67,auVar67,0x55);
        auVar43 = vsubps_avx(auVar43,auVar115);
        auVar61 = vfmadd213ps_fma(auVar43,auVar61,auVar115);
        fVar111 = auVar61._0_4_;
        auVar43 = vshufps_avx(auVar61,auVar61,0x55);
        auVar116._0_4_ = auVar60._0_4_ * fVar111 + auVar70._0_4_ * auVar43._0_4_;
        auVar116._4_4_ = auVar60._4_4_ * fVar111 + auVar70._4_4_ * auVar43._4_4_;
        auVar116._8_4_ = auVar60._8_4_ * fVar111 + auVar70._8_4_ * auVar43._8_4_;
        auVar116._12_4_ = auVar60._12_4_ * fVar111 + auVar70._12_4_ * auVar43._12_4_;
        auVar67 = vsubps_avx(auVar67,auVar116);
        auVar43 = vandps_avx512vl(auVar61,auVar264._0_16_);
        auVar94._0_16_ = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar94._0_16_,auVar43);
        bVar41 = auVar43._0_4_ <= fVar132;
        if (auVar43._0_4_ < fVar132) {
          auVar43 = vucomiss_avx512f(auVar57);
          if (bVar41) {
            auVar60 = vucomiss_avx512f(auVar43);
            auVar263 = ZEXT1664(auVar60);
            if (bVar41) {
              vmovshdup_avx(auVar43);
              auVar60 = vucomiss_avx512f(auVar57);
              if (bVar41) {
                auVar61 = vucomiss_avx512f(auVar60);
                auVar263 = ZEXT1664(auVar61);
                if (bVar41) {
                  auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar69 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar45 = vdpps_avx(auVar69,local_4c0,0x7f);
                  auVar46 = vdpps_avx(auVar69,local_4d0,0x7f);
                  auVar48 = vdpps_avx(auVar69,local_4e0,0x7f);
                  auVar49 = vdpps_avx(auVar69,local_4f0,0x7f);
                  auVar50 = vdpps_avx(auVar69,local_500,0x7f);
                  auVar53 = vdpps_avx(auVar69,local_510,0x7f);
                  auVar54 = vdpps_avx(auVar69,local_520,0x7f);
                  auVar69 = vdpps_avx(auVar69,local_530,0x7f);
                  auVar67 = vsubss_avx512f(auVar61,auVar60);
                  fVar111 = auVar60._0_4_;
                  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * auVar50._0_4_)),auVar67,auVar45
                                           );
                  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar111)),auVar67,auVar46
                                           );
                  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar111)),auVar67,auVar48
                                           );
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * auVar69._0_4_)),auVar67,auVar49
                                           );
                  auVar94._0_16_ = vsubss_avx512f(auVar61,auVar43);
                  auVar170._0_4_ = auVar94._0_4_;
                  fVar111 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
                  fVar223 = auVar43._0_4_;
                  fVar212 = fVar223 * 3.0 * auVar170._0_4_ * auVar170._0_4_;
                  fVar222 = auVar170._0_4_ * fVar223 * fVar223 * 3.0;
                  fVar224 = fVar223 * fVar223 * fVar223;
                  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar48._0_4_)),
                                            ZEXT416((uint)fVar222),auVar46);
                  auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar212),auVar45);
                  vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar111),auVar60);
                  auVar60 = vucomiss_avx512f(ZEXT416(uVar38));
                  if (bVar41) {
                    fVar225 = *(float *)(ray + k * 4 + 0x200);
                    if (auVar60._0_4_ <= fVar225) {
                      auVar61 = vshufps_avx(auVar43,auVar43,0x55);
                      auVar46 = vsubps_avx512vl(auVar59,auVar61);
                      fVar226 = auVar61._0_4_;
                      auVar204._0_4_ = fVar226 * (float)local_580._0_4_;
                      fVar180 = auVar61._4_4_;
                      auVar204._4_4_ = fVar180 * (float)local_580._4_4_;
                      fVar181 = auVar61._8_4_;
                      auVar204._8_4_ = fVar181 * fStack_578;
                      fVar182 = auVar61._12_4_;
                      auVar204._12_4_ = fVar182 * fStack_574;
                      auVar208._0_4_ = fVar226 * (float)local_590._0_4_;
                      auVar208._4_4_ = fVar180 * (float)local_590._4_4_;
                      auVar208._8_4_ = fVar181 * fStack_588;
                      auVar208._12_4_ = fVar182 * fStack_584;
                      auVar220._0_4_ = fVar226 * (float)local_5a0._0_4_;
                      auVar220._4_4_ = fVar180 * (float)local_5a0._4_4_;
                      auVar220._8_4_ = fVar181 * fStack_598;
                      auVar220._12_4_ = fVar182 * fStack_594;
                      auVar176._0_4_ = fVar226 * (float)local_5b0._0_4_;
                      auVar176._4_4_ = fVar180 * (float)local_5b0._4_4_;
                      auVar176._8_4_ = fVar181 * fStack_5a8;
                      auVar176._12_4_ = fVar182 * fStack_5a4;
                      auVar59 = vfmadd231ps_fma(auVar204,auVar46,local_540);
                      auVar61 = vfmadd231ps_fma(auVar208,auVar46,local_550);
                      auVar45 = vfmadd231ps_fma(auVar220,auVar46,local_560);
                      auVar46 = vfmadd231ps_fma(auVar176,auVar46,local_570);
                      auVar59 = vsubps_avx(auVar61,auVar59);
                      auVar61 = vsubps_avx(auVar45,auVar61);
                      auVar45 = vsubps_avx(auVar46,auVar45);
                      auVar221._0_4_ = fVar223 * auVar61._0_4_;
                      auVar221._4_4_ = fVar223 * auVar61._4_4_;
                      auVar221._8_4_ = fVar223 * auVar61._8_4_;
                      auVar221._12_4_ = fVar223 * auVar61._12_4_;
                      auVar170._4_4_ = auVar170._0_4_;
                      auVar170._8_4_ = auVar170._0_4_;
                      auVar170._12_4_ = auVar170._0_4_;
                      auVar59 = vfmadd231ps_fma(auVar221,auVar170,auVar59);
                      auVar177._0_4_ = fVar223 * auVar45._0_4_;
                      auVar177._4_4_ = fVar223 * auVar45._4_4_;
                      auVar177._8_4_ = fVar223 * auVar45._8_4_;
                      auVar177._12_4_ = fVar223 * auVar45._12_4_;
                      auVar61 = vfmadd231ps_fma(auVar177,auVar170,auVar61);
                      auVar178._0_4_ = fVar223 * auVar61._0_4_;
                      auVar178._4_4_ = fVar223 * auVar61._4_4_;
                      auVar178._8_4_ = fVar223 * auVar61._8_4_;
                      auVar178._12_4_ = fVar223 * auVar61._12_4_;
                      auVar59 = vfmadd231ps_fma(auVar178,auVar170,auVar59);
                      auVar19._8_4_ = 0x40400000;
                      auVar19._0_8_ = 0x4040000040400000;
                      auVar19._12_4_ = 0x40400000;
                      auVar94._0_16_ = vmulps_avx512vl(auVar59,auVar19);
                      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01e2b328:
                        bVar28 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar28 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar157._0_4_ = fVar224 * (float)local_5f0._0_4_;
                        auVar157._4_4_ = fVar224 * (float)local_5f0._4_4_;
                        auVar157._8_4_ = fVar224 * fStack_5e8;
                        auVar157._12_4_ = fVar224 * fStack_5e4;
                        auVar143._4_4_ = fVar222;
                        auVar143._0_4_ = fVar222;
                        auVar143._8_4_ = fVar222;
                        auVar143._12_4_ = fVar222;
                        auVar59 = vfmadd132ps_fma(auVar143,auVar157,local_5e0);
                        auVar137._4_4_ = fVar212;
                        auVar137._0_4_ = fVar212;
                        auVar137._8_4_ = fVar212;
                        auVar137._12_4_ = fVar212;
                        auVar59 = vfmadd132ps_fma(auVar137,auVar59,local_5d0);
                        auVar127._4_4_ = fVar111;
                        auVar127._0_4_ = fVar111;
                        auVar127._8_4_ = fVar111;
                        auVar127._12_4_ = fVar111;
                        auVar45 = vfmadd132ps_fma(auVar127,auVar59,local_5c0);
                        auVar59 = vshufps_avx(auVar45,auVar45,0xc9);
                        auVar61 = vshufps_avx(auVar94._0_16_,auVar94._0_16_,0xc9);
                        auVar128._0_4_ = auVar45._0_4_ * auVar61._0_4_;
                        auVar128._4_4_ = auVar45._4_4_ * auVar61._4_4_;
                        auVar128._8_4_ = auVar45._8_4_ * auVar61._8_4_;
                        auVar128._12_4_ = auVar45._12_4_ * auVar61._12_4_;
                        auVar59 = vfmsub231ps_fma(auVar128,auVar94._0_16_,auVar59);
                        local_200 = vbroadcastss_avx512f(auVar43);
                        auVar259 = vbroadcastss_avx512f(ZEXT416(1));
                        local_1c0 = vpermps_avx512f(auVar259,ZEXT1664(auVar43));
                        auVar259 = vpermps_avx512f(auVar259,ZEXT1664(auVar59));
                        auVar264 = vbroadcastss_avx512f(ZEXT416(2));
                        local_280 = vpermps_avx512f(auVar264,ZEXT1664(auVar59));
                        local_240 = vbroadcastss_avx512f(auVar59);
                        local_2c0[0] = (RTCHitN)auVar259[0];
                        local_2c0[1] = (RTCHitN)auVar259[1];
                        local_2c0[2] = (RTCHitN)auVar259[2];
                        local_2c0[3] = (RTCHitN)auVar259[3];
                        local_2c0[4] = (RTCHitN)auVar259[4];
                        local_2c0[5] = (RTCHitN)auVar259[5];
                        local_2c0[6] = (RTCHitN)auVar259[6];
                        local_2c0[7] = (RTCHitN)auVar259[7];
                        local_2c0[8] = (RTCHitN)auVar259[8];
                        local_2c0[9] = (RTCHitN)auVar259[9];
                        local_2c0[10] = (RTCHitN)auVar259[10];
                        local_2c0[0xb] = (RTCHitN)auVar259[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar259[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar259[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar259[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar259[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar259[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar259[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar259[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar259[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar259[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar259[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar259[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar259[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar259[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar259[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar259[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar259[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar259[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar259[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar259[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar259[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar259[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar259[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar259[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar259[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar259[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar259[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar259[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar259[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar259[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar259[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar259[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar259[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar259[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar259[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar259[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar259[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar259[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar259[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar259[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar259[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar259[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar259[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar259[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar259[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar259[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar259[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar259[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar259[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar259[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar259[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar259[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar259[0x3f];
                        local_180 = local_300._0_8_;
                        uStack_178 = local_300._8_8_;
                        uStack_170 = local_300._16_8_;
                        uStack_168 = local_300._24_8_;
                        uStack_160 = local_300._32_8_;
                        uStack_158 = local_300._40_8_;
                        uStack_150 = local_300._48_8_;
                        uStack_148 = local_300._56_8_;
                        auVar259 = vmovdqa64_avx512f(local_340);
                        local_140 = vmovdqa64_avx512f(auVar259);
                        vpcmpeqd_avx2(auVar259._0_32_,auVar259._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = auVar60._0_4_;
                        auVar108 = vmovdqa64_avx512f(local_380);
                        local_440 = vmovdqa64_avx512f(auVar108);
                        local_620.valid = (int *)local_440;
                        local_620.geometryUserPtr = pGVar9->userPtr;
                        local_620.context = context->user;
                        local_620.ray = (RTCRayN *)ray;
                        local_620.hit = local_2c0;
                        local_620.N = 0x10;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_620);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar262 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar260 = ZEXT1664(auVar43);
                          auVar263 = ZEXT464(0x3f800000);
                          auVar43 = vxorps_avx512vl(auVar57,auVar57);
                          auVar117 = ZEXT1664(auVar43);
                          auVar108 = vmovdqa64_avx512f(local_440);
                        }
                        auVar43 = auVar117._0_16_;
                        uVar15 = vptestmd_avx512f(auVar108,auVar108);
                        auVar109._32_32_ = auVar108._32_32_;
                        if ((short)uVar15 == 0) {
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar259 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar264 = ZEXT1664(auVar43);
                          auVar109._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar261 = ZEXT3264(auVar109._0_32_);
                          auVar94._16_48_ = auVar109._16_48_;
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          in_ZMM23 = ZEXT1664(auVar43);
                          auVar94._0_16_ = auVar56;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if (p_Var14 == (RTCFilterFunctionN)0x0) {
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar259 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar264 = ZEXT1664(auVar43);
                            auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar261 = ZEXT3264(auVar76);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            in_ZMM23 = ZEXT1664(auVar43);
                          }
                          else {
                            auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar259 = ZEXT1664(auVar57);
                            auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar264 = ZEXT1664(auVar57);
                            auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar261 = ZEXT3264(auVar76);
                            auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            in_ZMM23 = ZEXT1664(auVar57);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var14)(&local_620);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar262 = ZEXT1664(auVar57);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              in_ZMM23 = ZEXT1664(auVar57);
                              auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar261 = ZEXT3264(auVar76);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar260 = ZEXT1664(auVar57);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar264 = ZEXT1664(auVar57);
                              auVar263 = ZEXT464(0x3f800000);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar259 = ZEXT1664(auVar57);
                              auVar43 = vxorps_avx512vl(auVar43,auVar43);
                              auVar117 = ZEXT1664(auVar43);
                              auVar108 = vmovdqa64_avx512f(local_440);
                            }
                          }
                          uVar3 = vptestmd_avx512f(auVar108,auVar108);
                          auVar108 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar41 = (bool)((byte)uVar3 & 1);
                          auVar94._0_4_ =
                               (uint)bVar41 * auVar108._0_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x200);
                          bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                          auVar94._4_4_ =
                               (uint)bVar41 * auVar108._4_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x204);
                          bVar41 = (bool)((byte)(uVar3 >> 2) & 1);
                          auVar94._8_4_ =
                               (uint)bVar41 * auVar108._8_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x208);
                          bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                          auVar94._12_4_ =
                               (uint)bVar41 * auVar108._12_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x20c);
                          bVar41 = (bool)((byte)(uVar3 >> 4) & 1);
                          auVar94._16_4_ =
                               (uint)bVar41 * auVar108._16_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x210);
                          bVar41 = (bool)((byte)(uVar3 >> 5) & 1);
                          auVar94._20_4_ =
                               (uint)bVar41 * auVar108._20_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x214);
                          bVar41 = (bool)((byte)(uVar3 >> 6) & 1);
                          auVar94._24_4_ =
                               (uint)bVar41 * auVar108._24_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x218);
                          bVar41 = (bool)((byte)(uVar3 >> 7) & 1);
                          auVar94._28_4_ =
                               (uint)bVar41 * auVar108._28_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x21c);
                          bVar41 = (bool)((byte)(uVar3 >> 8) & 1);
                          auVar94._32_4_ =
                               (uint)bVar41 * auVar108._32_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x220);
                          bVar41 = (bool)((byte)(uVar3 >> 9) & 1);
                          auVar94._36_4_ =
                               (uint)bVar41 * auVar108._36_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x224);
                          bVar41 = (bool)((byte)(uVar3 >> 10) & 1);
                          auVar94._40_4_ =
                               (uint)bVar41 * auVar108._40_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x228);
                          bVar41 = (bool)((byte)(uVar3 >> 0xb) & 1);
                          auVar94._44_4_ =
                               (uint)bVar41 * auVar108._44_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x22c);
                          bVar41 = (bool)((byte)(uVar3 >> 0xc) & 1);
                          auVar94._48_4_ =
                               (uint)bVar41 * auVar108._48_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x230);
                          bVar41 = (bool)((byte)(uVar3 >> 0xd) & 1);
                          auVar94._52_4_ =
                               (uint)bVar41 * auVar108._52_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x234);
                          bVar41 = (bool)((byte)(uVar3 >> 0xe) & 1);
                          auVar94._56_4_ =
                               (uint)bVar41 * auVar108._56_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x238);
                          bVar41 = SUB81(uVar3 >> 0xf,0);
                          auVar94._60_4_ =
                               (uint)bVar41 * auVar108._60_4_ |
                               (uint)!bVar41 * *(int *)(local_620.ray + 0x23c);
                          *(undefined1 (*) [64])(local_620.ray + 0x200) = auVar94;
                          bVar28 = 1;
                          if ((short)uVar3 != 0) goto LAB_01e2b32a;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar225;
                        goto LAB_01e2b328;
                      }
LAB_01e2b32a:
                      bVar37 = (bool)(bVar37 | bVar28);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01e2a3e4;
    }
    auVar60 = vinsertps_avx(auVar133,auVar65,0x10);
LAB_01e2b33b:
    auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }